

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<8,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  void *pvVar15;
  __int_type_conflict _Var16;
  long lVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  bool bVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint uVar71;
  uint uVar72;
  ulong uVar73;
  long lVar74;
  uint uVar75;
  uint uVar77;
  ulong uVar78;
  long lVar79;
  ulong uVar80;
  float t1;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar126 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar161;
  float fVar178;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar176;
  float fVar177;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar182;
  float fVar202;
  float fVar203;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar200 [32];
  float fVar204;
  undefined1 auVar201 [32];
  float fVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar214 [16];
  float fVar223;
  float fVar224;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar220 [32];
  float fVar225;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  vfloat4 b0;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float pp;
  float fVar285;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar286;
  float fVar297;
  float fVar298;
  vfloat4 a0_1;
  float fVar299;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar300;
  float fVar308;
  undefined1 auVar301 [16];
  float fVar307;
  float fVar309;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar305;
  float fVar306;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float in_register_0000151c;
  undefined1 auVar304 [32];
  float fVar316;
  float fVar324;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  float fVar323;
  undefined1 auVar321 [32];
  float fVar325;
  float fVar326;
  undefined1 auVar322 [32];
  float fVar327;
  float fVar328;
  float fVar333;
  float fVar335;
  float fVar336;
  undefined1 auVar329 [16];
  float fVar332;
  float fVar334;
  float in_register_0000159c;
  undefined1 auVar330 [32];
  undefined1 auVar331 [64];
  vfloat4 a0;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  float in_register_000015dc;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_700 [16];
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float local_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  uint auStack_460 [4];
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  float afStack_320 [8];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar76;
  undefined1 auVar160 [32];
  undefined1 auVar341 [32];
  
  PVar12 = prim[1];
  uVar73 = (ulong)(byte)PVar12;
  lVar79 = uVar73 * 5;
  auVar105 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar105 = vinsertps_avx(auVar105,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar289 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar289 = vinsertps_avx(auVar289,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar182 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar105 = vsubps_avx(auVar105,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  auVar96._0_4_ = fVar182 * auVar105._0_4_;
  auVar96._4_4_ = fVar182 * auVar105._4_4_;
  auVar96._8_4_ = fVar182 * auVar105._8_4_;
  auVar96._12_4_ = fVar182 * auVar105._12_4_;
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 10)));
  auVar183._0_4_ = fVar182 * auVar289._0_4_;
  auVar183._4_4_ = fVar182 * auVar289._4_4_;
  auVar183._8_4_ = fVar182 * auVar289._8_4_;
  auVar183._12_4_ = fVar182 * auVar289._12_4_;
  auVar86._16_16_ = auVar198;
  auVar86._0_16_ = auVar105;
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar79 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar79 + 10)));
  auVar132._16_16_ = auVar289;
  auVar132._0_16_ = auVar105;
  auVar18 = vcvtdq2ps_avx(auVar132);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 10)));
  auVar153._16_16_ = auVar289;
  auVar153._0_16_ = auVar105;
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 10)));
  auVar19 = vcvtdq2ps_avx(auVar153);
  auVar154._16_16_ = auVar289;
  auVar154._0_16_ = auVar105;
  auVar20 = vcvtdq2ps_avx(auVar154);
  uVar80 = (ulong)((uint)(byte)PVar12 * 0xc);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 10)));
  auVar220._16_16_ = auVar289;
  auVar220._0_16_ = auVar105;
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + uVar73 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar220);
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + uVar73 + 10)));
  auVar238._16_16_ = auVar289;
  auVar238._0_16_ = auVar105;
  lVar74 = uVar73 * 9;
  uVar80 = (ulong)(uint)((int)lVar74 * 2);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar238);
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 10)));
  auVar239._16_16_ = auVar289;
  auVar239._0_16_ = auVar105;
  auVar23 = vcvtdq2ps_avx(auVar239);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + uVar73 + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + uVar73 + 10)));
  auVar273._16_16_ = auVar289;
  auVar273._0_16_ = auVar105;
  uVar80 = (ulong)(uint)((int)lVar79 << 2);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 10)));
  auVar24 = vcvtdq2ps_avx(auVar273);
  auVar282._16_16_ = auVar289;
  auVar282._0_16_ = auVar105;
  auVar25 = vcvtdq2ps_avx(auVar282);
  auVar105 = vshufps_avx(auVar183,auVar183,0);
  auVar289 = vshufps_avx(auVar183,auVar183,0x55);
  auVar198 = vshufps_avx(auVar183,auVar183,0xaa);
  fVar182 = auVar198._0_4_;
  fVar208 = auVar198._4_4_;
  fVar202 = auVar198._8_4_;
  fVar223 = auVar198._12_4_;
  fVar203 = auVar289._0_4_;
  fVar224 = auVar289._4_4_;
  fVar204 = auVar289._8_4_;
  fVar225 = auVar289._12_4_;
  fVar205 = auVar105._0_4_;
  fVar226 = auVar105._4_4_;
  fVar206 = auVar105._8_4_;
  fVar227 = auVar105._12_4_;
  auVar304._0_4_ = fVar205 * auVar86._0_4_ + fVar203 * auVar18._0_4_ + fVar182 * auVar19._0_4_;
  auVar304._4_4_ = fVar226 * auVar86._4_4_ + fVar224 * auVar18._4_4_ + fVar208 * auVar19._4_4_;
  auVar304._8_4_ = fVar206 * auVar86._8_4_ + fVar204 * auVar18._8_4_ + fVar202 * auVar19._8_4_;
  auVar304._12_4_ = fVar227 * auVar86._12_4_ + fVar225 * auVar18._12_4_ + fVar223 * auVar19._12_4_;
  auVar304._16_4_ = fVar205 * auVar86._16_4_ + fVar203 * auVar18._16_4_ + fVar182 * auVar19._16_4_;
  auVar304._20_4_ = fVar226 * auVar86._20_4_ + fVar224 * auVar18._20_4_ + fVar208 * auVar19._20_4_;
  auVar304._24_4_ = fVar206 * auVar86._24_4_ + fVar204 * auVar18._24_4_ + fVar202 * auVar19._24_4_;
  auVar304._28_4_ = fVar225 + in_register_000015dc + in_register_0000151c;
  auVar295._0_4_ = fVar205 * auVar20._0_4_ + fVar203 * auVar21._0_4_ + auVar22._0_4_ * fVar182;
  auVar295._4_4_ = fVar226 * auVar20._4_4_ + fVar224 * auVar21._4_4_ + auVar22._4_4_ * fVar208;
  auVar295._8_4_ = fVar206 * auVar20._8_4_ + fVar204 * auVar21._8_4_ + auVar22._8_4_ * fVar202;
  auVar295._12_4_ = fVar227 * auVar20._12_4_ + fVar225 * auVar21._12_4_ + auVar22._12_4_ * fVar223;
  auVar295._16_4_ = fVar205 * auVar20._16_4_ + fVar203 * auVar21._16_4_ + auVar22._16_4_ * fVar182;
  auVar295._20_4_ = fVar226 * auVar20._20_4_ + fVar224 * auVar21._20_4_ + auVar22._20_4_ * fVar208;
  auVar295._24_4_ = fVar206 * auVar20._24_4_ + fVar204 * auVar21._24_4_ + auVar22._24_4_ * fVar202;
  auVar295._28_4_ = fVar225 + in_register_000015dc + in_register_0000159c;
  auVar200._0_4_ = fVar205 * auVar23._0_4_ + fVar203 * auVar24._0_4_ + auVar25._0_4_ * fVar182;
  auVar200._4_4_ = fVar226 * auVar23._4_4_ + fVar224 * auVar24._4_4_ + auVar25._4_4_ * fVar208;
  auVar200._8_4_ = fVar206 * auVar23._8_4_ + fVar204 * auVar24._8_4_ + auVar25._8_4_ * fVar202;
  auVar200._12_4_ = fVar227 * auVar23._12_4_ + fVar225 * auVar24._12_4_ + auVar25._12_4_ * fVar223;
  auVar200._16_4_ = fVar205 * auVar23._16_4_ + fVar203 * auVar24._16_4_ + auVar25._16_4_ * fVar182;
  auVar200._20_4_ = fVar226 * auVar23._20_4_ + fVar224 * auVar24._20_4_ + auVar25._20_4_ * fVar208;
  auVar200._24_4_ = fVar206 * auVar23._24_4_ + fVar204 * auVar24._24_4_ + auVar25._24_4_ * fVar202;
  auVar200._28_4_ = fVar227 + fVar225 + fVar223;
  auVar105 = vshufps_avx(auVar96,auVar96,0);
  auVar289 = vshufps_avx(auVar96,auVar96,0x55);
  auVar198 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar208 = auVar198._0_4_;
  fVar202 = auVar198._4_4_;
  fVar223 = auVar198._8_4_;
  fVar203 = auVar198._12_4_;
  fVar226 = auVar289._0_4_;
  fVar206 = auVar289._4_4_;
  fVar227 = auVar289._8_4_;
  fVar207 = auVar289._12_4_;
  fVar224 = auVar105._0_4_;
  fVar204 = auVar105._4_4_;
  fVar225 = auVar105._8_4_;
  fVar205 = auVar105._12_4_;
  fVar182 = auVar86._28_4_;
  auVar115._0_4_ = fVar224 * auVar86._0_4_ + fVar226 * auVar18._0_4_ + fVar208 * auVar19._0_4_;
  auVar115._4_4_ = fVar204 * auVar86._4_4_ + fVar206 * auVar18._4_4_ + fVar202 * auVar19._4_4_;
  auVar115._8_4_ = fVar225 * auVar86._8_4_ + fVar227 * auVar18._8_4_ + fVar223 * auVar19._8_4_;
  auVar115._12_4_ = fVar205 * auVar86._12_4_ + fVar207 * auVar18._12_4_ + fVar203 * auVar19._12_4_;
  auVar115._16_4_ = fVar224 * auVar86._16_4_ + fVar226 * auVar18._16_4_ + fVar208 * auVar19._16_4_;
  auVar115._20_4_ = fVar204 * auVar86._20_4_ + fVar206 * auVar18._20_4_ + fVar202 * auVar19._20_4_;
  auVar115._24_4_ = fVar225 * auVar86._24_4_ + fVar227 * auVar18._24_4_ + fVar223 * auVar19._24_4_;
  auVar115._28_4_ = fVar182 + auVar18._28_4_ + auVar19._28_4_;
  auVar133._0_4_ = fVar224 * auVar20._0_4_ + auVar22._0_4_ * fVar208 + fVar226 * auVar21._0_4_;
  auVar133._4_4_ = fVar204 * auVar20._4_4_ + auVar22._4_4_ * fVar202 + fVar206 * auVar21._4_4_;
  auVar133._8_4_ = fVar225 * auVar20._8_4_ + auVar22._8_4_ * fVar223 + fVar227 * auVar21._8_4_;
  auVar133._12_4_ = fVar205 * auVar20._12_4_ + auVar22._12_4_ * fVar203 + fVar207 * auVar21._12_4_;
  auVar133._16_4_ = fVar224 * auVar20._16_4_ + auVar22._16_4_ * fVar208 + fVar226 * auVar21._16_4_;
  auVar133._20_4_ = fVar204 * auVar20._20_4_ + auVar22._20_4_ * fVar202 + fVar206 * auVar21._20_4_;
  auVar133._24_4_ = fVar225 * auVar20._24_4_ + auVar22._24_4_ * fVar223 + fVar227 * auVar21._24_4_;
  auVar133._28_4_ = fVar182 + auVar22._28_4_ + auVar19._28_4_;
  auVar155._8_4_ = 0x7fffffff;
  auVar155._0_8_ = 0x7fffffff7fffffff;
  auVar155._12_4_ = 0x7fffffff;
  auVar155._16_4_ = 0x7fffffff;
  auVar155._20_4_ = 0x7fffffff;
  auVar155._24_4_ = 0x7fffffff;
  auVar155._28_4_ = 0x7fffffff;
  auVar172._8_4_ = 0x219392ef;
  auVar172._0_8_ = 0x219392ef219392ef;
  auVar172._12_4_ = 0x219392ef;
  auVar172._16_4_ = 0x219392ef;
  auVar172._20_4_ = 0x219392ef;
  auVar172._24_4_ = 0x219392ef;
  auVar172._28_4_ = 0x219392ef;
  auVar86 = vandps_avx(auVar304,auVar155);
  auVar86 = vcmpps_avx(auVar86,auVar172,1);
  auVar18 = vblendvps_avx(auVar304,auVar172,auVar86);
  auVar86 = vandps_avx(auVar295,auVar155);
  auVar86 = vcmpps_avx(auVar86,auVar172,1);
  auVar19 = vblendvps_avx(auVar295,auVar172,auVar86);
  auVar86 = vandps_avx(auVar200,auVar155);
  auVar86 = vcmpps_avx(auVar86,auVar172,1);
  auVar86 = vblendvps_avx(auVar200,auVar172,auVar86);
  auVar156._0_4_ = fVar224 * auVar23._0_4_ + fVar226 * auVar24._0_4_ + auVar25._0_4_ * fVar208;
  auVar156._4_4_ = fVar204 * auVar23._4_4_ + fVar206 * auVar24._4_4_ + auVar25._4_4_ * fVar202;
  auVar156._8_4_ = fVar225 * auVar23._8_4_ + fVar227 * auVar24._8_4_ + auVar25._8_4_ * fVar223;
  auVar156._12_4_ = fVar205 * auVar23._12_4_ + fVar207 * auVar24._12_4_ + auVar25._12_4_ * fVar203;
  auVar156._16_4_ = fVar224 * auVar23._16_4_ + fVar226 * auVar24._16_4_ + auVar25._16_4_ * fVar208;
  auVar156._20_4_ = fVar204 * auVar23._20_4_ + fVar206 * auVar24._20_4_ + auVar25._20_4_ * fVar202;
  auVar156._24_4_ = fVar225 * auVar23._24_4_ + fVar227 * auVar24._24_4_ + auVar25._24_4_ * fVar223;
  auVar156._28_4_ = fVar182 + auVar21._28_4_ + fVar203;
  auVar20 = vrcpps_avx(auVar18);
  fVar182 = auVar20._0_4_;
  fVar202 = auVar20._4_4_;
  auVar21._4_4_ = auVar18._4_4_ * fVar202;
  auVar21._0_4_ = auVar18._0_4_ * fVar182;
  fVar203 = auVar20._8_4_;
  auVar21._8_4_ = auVar18._8_4_ * fVar203;
  fVar204 = auVar20._12_4_;
  auVar21._12_4_ = auVar18._12_4_ * fVar204;
  fVar205 = auVar20._16_4_;
  auVar21._16_4_ = auVar18._16_4_ * fVar205;
  fVar206 = auVar20._20_4_;
  auVar21._20_4_ = auVar18._20_4_ * fVar206;
  fVar207 = auVar20._24_4_;
  auVar21._24_4_ = auVar18._24_4_ * fVar207;
  auVar21._28_4_ = auVar200._28_4_;
  auVar240._8_4_ = 0x3f800000;
  auVar240._0_8_ = &DAT_3f8000003f800000;
  auVar240._12_4_ = 0x3f800000;
  auVar240._16_4_ = 0x3f800000;
  auVar240._20_4_ = 0x3f800000;
  auVar240._24_4_ = 0x3f800000;
  auVar240._28_4_ = 0x3f800000;
  auVar21 = vsubps_avx(auVar240,auVar21);
  auVar18 = vrcpps_avx(auVar19);
  fVar182 = fVar182 + fVar182 * auVar21._0_4_;
  fVar202 = fVar202 + fVar202 * auVar21._4_4_;
  fVar203 = fVar203 + fVar203 * auVar21._8_4_;
  fVar204 = fVar204 + fVar204 * auVar21._12_4_;
  fVar205 = fVar205 + fVar205 * auVar21._16_4_;
  fVar206 = fVar206 + fVar206 * auVar21._20_4_;
  fVar207 = fVar207 + fVar207 * auVar21._24_4_;
  fVar208 = auVar18._0_4_;
  fVar223 = auVar18._4_4_;
  auVar22._4_4_ = auVar19._4_4_ * fVar223;
  auVar22._0_4_ = auVar19._0_4_ * fVar208;
  fVar224 = auVar18._8_4_;
  auVar22._8_4_ = auVar19._8_4_ * fVar224;
  fVar225 = auVar18._12_4_;
  auVar22._12_4_ = auVar19._12_4_ * fVar225;
  fVar226 = auVar18._16_4_;
  auVar22._16_4_ = auVar19._16_4_ * fVar226;
  fVar227 = auVar18._20_4_;
  auVar22._20_4_ = auVar19._20_4_ * fVar227;
  fVar228 = auVar18._24_4_;
  auVar22._24_4_ = auVar19._24_4_ * fVar228;
  auVar22._28_4_ = auVar20._28_4_;
  auVar18 = vsubps_avx(auVar240,auVar22);
  fVar208 = fVar208 + fVar208 * auVar18._0_4_;
  fVar223 = fVar223 + fVar223 * auVar18._4_4_;
  fVar224 = fVar224 + fVar224 * auVar18._8_4_;
  fVar225 = fVar225 + fVar225 * auVar18._12_4_;
  fVar226 = fVar226 + fVar226 * auVar18._16_4_;
  fVar227 = fVar227 + fVar227 * auVar18._20_4_;
  fVar228 = fVar228 + fVar228 * auVar18._24_4_;
  auVar18 = vrcpps_avx(auVar86);
  fVar161 = auVar18._0_4_;
  fVar176 = auVar18._4_4_;
  auVar19._4_4_ = fVar176 * auVar86._4_4_;
  auVar19._0_4_ = fVar161 * auVar86._0_4_;
  fVar177 = auVar18._8_4_;
  auVar19._8_4_ = fVar177 * auVar86._8_4_;
  fVar178 = auVar18._12_4_;
  auVar19._12_4_ = fVar178 * auVar86._12_4_;
  fVar179 = auVar18._16_4_;
  auVar19._16_4_ = fVar179 * auVar86._16_4_;
  fVar180 = auVar18._20_4_;
  auVar19._20_4_ = fVar180 * auVar86._20_4_;
  fVar181 = auVar18._24_4_;
  auVar19._24_4_ = fVar181 * auVar86._24_4_;
  auVar19._28_4_ = auVar86._28_4_;
  auVar86 = vsubps_avx(auVar240,auVar19);
  fVar161 = fVar161 + fVar161 * auVar86._0_4_;
  fVar176 = fVar176 + fVar176 * auVar86._4_4_;
  fVar177 = fVar177 + fVar177 * auVar86._8_4_;
  fVar178 = fVar178 + fVar178 * auVar86._12_4_;
  fVar179 = fVar179 + fVar179 * auVar86._16_4_;
  fVar180 = fVar180 + fVar180 * auVar86._20_4_;
  fVar181 = fVar181 + fVar181 * auVar86._24_4_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar105 = vpmovsxwd_avx(auVar105);
  auVar289._8_8_ = 0;
  auVar289._0_8_ = *(ulong *)(prim + uVar73 * 7 + 0xe);
  auVar289 = vpmovsxwd_avx(auVar289);
  auVar87._16_16_ = auVar289;
  auVar87._0_16_ = auVar105;
  auVar86 = vcvtdq2ps_avx(auVar87);
  auVar86 = vsubps_avx(auVar86,auVar115);
  auVar81._0_4_ = fVar182 * auVar86._0_4_;
  auVar81._4_4_ = fVar202 * auVar86._4_4_;
  auVar81._8_4_ = fVar203 * auVar86._8_4_;
  auVar81._12_4_ = fVar204 * auVar86._12_4_;
  auVar20._16_4_ = fVar205 * auVar86._16_4_;
  auVar20._0_16_ = auVar81;
  auVar20._20_4_ = fVar206 * auVar86._20_4_;
  auVar20._24_4_ = fVar207 * auVar86._24_4_;
  auVar20._28_4_ = auVar86._28_4_;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + lVar74 + 6);
  auVar105 = vpmovsxwd_avx(auVar198);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar74 + 0xe);
  auVar289 = vpmovsxwd_avx(auVar9);
  auVar241._16_16_ = auVar289;
  auVar241._0_16_ = auVar105;
  auVar86 = vcvtdq2ps_avx(auVar241);
  auVar86 = vsubps_avx(auVar86,auVar115);
  auVar97._0_4_ = fVar182 * auVar86._0_4_;
  auVar97._4_4_ = fVar202 * auVar86._4_4_;
  auVar97._8_4_ = fVar203 * auVar86._8_4_;
  auVar97._12_4_ = fVar204 * auVar86._12_4_;
  auVar23._16_4_ = fVar205 * auVar86._16_4_;
  auVar23._0_16_ = auVar97;
  auVar23._20_4_ = fVar206 * auVar86._20_4_;
  auVar23._24_4_ = fVar207 * auVar86._24_4_;
  auVar23._28_4_ = auVar86._28_4_;
  lVar79 = (ulong)(byte)PVar12 * 0x10;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar79 + 6);
  auVar105 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar79 + 0xe);
  auVar289 = vpmovsxwd_avx(auVar11);
  lVar79 = lVar79 + uVar73 * -2;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + lVar79 + 6);
  auVar198 = vpmovsxwd_avx(auVar150);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + lVar79 + 0xe);
  auVar9 = vpmovsxwd_avx(auVar104);
  auVar201._16_16_ = auVar9;
  auVar201._0_16_ = auVar198;
  auVar86 = vcvtdq2ps_avx(auVar201);
  auVar86 = vsubps_avx(auVar86,auVar133);
  auVar184._0_4_ = fVar208 * auVar86._0_4_;
  auVar184._4_4_ = fVar223 * auVar86._4_4_;
  auVar184._8_4_ = fVar224 * auVar86._8_4_;
  auVar184._12_4_ = fVar225 * auVar86._12_4_;
  auVar24._16_4_ = fVar226 * auVar86._16_4_;
  auVar24._0_16_ = auVar184;
  auVar24._20_4_ = fVar227 * auVar86._20_4_;
  auVar24._24_4_ = fVar228 * auVar86._24_4_;
  auVar24._28_4_ = auVar86._28_4_;
  auVar242._16_16_ = auVar289;
  auVar242._0_16_ = auVar105;
  auVar86 = vcvtdq2ps_avx(auVar242);
  auVar86 = vsubps_avx(auVar86,auVar133);
  auVar122._0_4_ = fVar208 * auVar86._0_4_;
  auVar122._4_4_ = fVar223 * auVar86._4_4_;
  auVar122._8_4_ = fVar224 * auVar86._8_4_;
  auVar122._12_4_ = fVar225 * auVar86._12_4_;
  auVar25._16_4_ = fVar226 * auVar86._16_4_;
  auVar25._0_16_ = auVar122;
  auVar25._20_4_ = fVar227 * auVar86._20_4_;
  auVar25._24_4_ = fVar228 * auVar86._24_4_;
  auVar25._28_4_ = auVar86._28_4_;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + uVar80 + uVar73 + 6);
  auVar105 = vpmovsxwd_avx(auVar149);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar80 + uVar73 + 0xe);
  auVar289 = vpmovsxwd_avx(auVar84);
  auVar221._16_16_ = auVar289;
  auVar221._0_16_ = auVar105;
  auVar86 = vcvtdq2ps_avx(auVar221);
  auVar86 = vsubps_avx(auVar86,auVar156);
  auVar209._0_4_ = fVar161 * auVar86._0_4_;
  auVar209._4_4_ = fVar176 * auVar86._4_4_;
  auVar209._8_4_ = fVar177 * auVar86._8_4_;
  auVar209._12_4_ = fVar178 * auVar86._12_4_;
  auVar26._16_4_ = fVar179 * auVar86._16_4_;
  auVar26._0_16_ = auVar209;
  auVar26._20_4_ = fVar180 * auVar86._20_4_;
  auVar26._24_4_ = fVar181 * auVar86._24_4_;
  auVar26._28_4_ = auVar86._28_4_;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 6);
  auVar105 = vpmovsxwd_avx(auVar127);
  auVar261._8_8_ = 0;
  auVar261._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 0xe);
  auVar289 = vpmovsxwd_avx(auVar261);
  auVar243._16_16_ = auVar289;
  auVar243._0_16_ = auVar105;
  auVar86 = vcvtdq2ps_avx(auVar243);
  auVar86 = vsubps_avx(auVar86,auVar156);
  auVar138._0_4_ = fVar161 * auVar86._0_4_;
  auVar138._4_4_ = fVar176 * auVar86._4_4_;
  auVar138._8_4_ = fVar177 * auVar86._8_4_;
  auVar138._12_4_ = fVar178 * auVar86._12_4_;
  auVar27._16_4_ = fVar179 * auVar86._16_4_;
  auVar27._0_16_ = auVar138;
  auVar27._20_4_ = fVar180 * auVar86._20_4_;
  auVar27._24_4_ = fVar181 * auVar86._24_4_;
  auVar27._28_4_ = auVar86._28_4_;
  auVar105 = vpminsd_avx(auVar20._16_16_,auVar23._16_16_);
  auVar289 = vpminsd_avx(auVar81,auVar97);
  auVar283._16_16_ = auVar105;
  auVar283._0_16_ = auVar289;
  auVar105 = vpminsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar289 = vpminsd_avx(auVar184,auVar122);
  auVar296._16_16_ = auVar105;
  auVar296._0_16_ = auVar289;
  auVar86 = vmaxps_avx(auVar283,auVar296);
  auVar105 = vpminsd_avx(auVar26._16_16_,auVar27._16_16_);
  auVar289 = vpminsd_avx(auVar209,auVar138);
  auVar321._16_16_ = auVar105;
  auVar321._0_16_ = auVar289;
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar330._4_4_ = uVar6;
  auVar330._0_4_ = uVar6;
  auVar330._8_4_ = uVar6;
  auVar330._12_4_ = uVar6;
  auVar330._16_4_ = uVar6;
  auVar330._20_4_ = uVar6;
  auVar330._24_4_ = uVar6;
  auVar330._28_4_ = uVar6;
  auVar18 = vmaxps_avx(auVar321,auVar330);
  auVar86 = vmaxps_avx(auVar86,auVar18);
  local_2c0._4_4_ = auVar86._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar86._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar86._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar86._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar86._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar86._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar86._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar86._28_4_;
  auVar105 = vpmaxsd_avx(auVar20._16_16_,auVar23._16_16_);
  auVar289 = vpmaxsd_avx(auVar81,auVar97);
  auVar88._16_16_ = auVar105;
  auVar88._0_16_ = auVar289;
  auVar105 = vpmaxsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar289 = vpmaxsd_avx(auVar184,auVar122);
  auVar116._16_16_ = auVar105;
  auVar116._0_16_ = auVar289;
  auVar86 = vminps_avx(auVar88,auVar116);
  auVar105 = vpmaxsd_avx(auVar26._16_16_,auVar27._16_16_);
  auVar289 = vpmaxsd_avx(auVar209,auVar138);
  auVar117._16_16_ = auVar105;
  auVar117._0_16_ = auVar289;
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar134._4_4_ = uVar6;
  auVar134._0_4_ = uVar6;
  auVar134._8_4_ = uVar6;
  auVar134._12_4_ = uVar6;
  auVar134._16_4_ = uVar6;
  auVar134._20_4_ = uVar6;
  auVar134._24_4_ = uVar6;
  auVar134._28_4_ = uVar6;
  auVar18 = vminps_avx(auVar117,auVar134);
  auVar86 = vminps_avx(auVar86,auVar18);
  auVar18._4_4_ = auVar86._4_4_ * 1.0000004;
  auVar18._0_4_ = auVar86._0_4_ * 1.0000004;
  auVar18._8_4_ = auVar86._8_4_ * 1.0000004;
  auVar18._12_4_ = auVar86._12_4_ * 1.0000004;
  auVar18._16_4_ = auVar86._16_4_ * 1.0000004;
  auVar18._20_4_ = auVar86._20_4_ * 1.0000004;
  auVar18._24_4_ = auVar86._24_4_ * 1.0000004;
  auVar18._28_4_ = auVar86._28_4_;
  auVar86 = vcmpps_avx(local_2c0,auVar18,2);
  auVar105 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar118._16_16_ = auVar105;
  auVar118._0_16_ = auVar105;
  auVar18 = vcvtdq2ps_avx(auVar118);
  auVar18 = vcmpps_avx(_DAT_02020f40,auVar18,1);
  auVar86 = vandps_avx(auVar86,auVar18);
  uVar71 = vmovmskps_avx(auVar86);
  if (uVar71 == 0) {
    return;
  }
  uVar71 = uVar71 & 0xff;
  auVar89._16_16_ = mm_lookupmask_ps._240_16_;
  auVar89._0_16_ = mm_lookupmask_ps._240_16_;
  local_340 = vblendps_avx(auVar89,ZEXT832(0) << 0x20,0x80);
  uVar77 = 1 << ((byte)k & 0x1f);
  uVar73 = (ulong)((uVar77 & 0xf) << 4);
  lVar79 = (long)((int)uVar77 >> 4) * 0x10;
  auVar331 = ZEXT1664((undefined1  [16])0x0);
LAB_010e271c:
  uVar80 = (ulong)uVar71;
  lVar74 = 0;
  if (uVar80 != 0) {
    for (; (uVar71 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
    }
  }
  uVar71 = *(uint *)(prim + 2);
  uVar77 = *(uint *)(prim + lVar74 * 4 + 6);
  pGVar13 = (context->scene->geometries).items[uVar71].ptr;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                           pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar77);
  p_Var14 = pGVar13[1].intersectionFilterN;
  pvVar15 = pGVar13[2].userPtr;
  _Var16 = pGVar13[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var16 + uVar78 * (long)pvVar15);
  fVar182 = *pfVar1;
  fVar208 = pfVar1[1];
  fVar202 = pfVar1[2];
  fVar223 = pfVar1[3];
  pfVar1 = (float *)(_Var16 + (uVar78 + 1) * (long)pvVar15);
  pfVar2 = (float *)(_Var16 + (uVar78 + 2) * (long)pvVar15);
  pfVar3 = (float *)(_Var16 + (long)pvVar15 * (uVar78 + 3));
  fVar203 = *pfVar3;
  fVar224 = pfVar3[1];
  fVar204 = pfVar3[2];
  fVar225 = pfVar3[3];
  uVar80 = uVar80 - 1 & uVar80;
  lVar74 = *(long *)&pGVar13[1].time_range.upper;
  pfVar3 = (float *)(lVar74 + (long)p_Var14 * uVar78);
  fVar205 = *pfVar3;
  fVar226 = pfVar3[1];
  fVar206 = pfVar3[2];
  fVar227 = pfVar3[3];
  pfVar3 = (float *)(lVar74 + (long)p_Var14 * (uVar78 + 1));
  pfVar4 = (float *)(lVar74 + (long)p_Var14 * (uVar78 + 2));
  lVar17 = 0;
  if (uVar80 != 0) {
    for (; (uVar80 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
    }
  }
  pfVar5 = (float *)(lVar74 + (long)p_Var14 * (uVar78 + 3));
  fVar207 = *pfVar5;
  fVar228 = pfVar5[1];
  fVar161 = pfVar5[2];
  fVar176 = pfVar5[3];
  if (((uVar80 != 0) && (uVar78 = uVar80 - 1 & uVar80, uVar78 != 0)) && (lVar74 = 0, uVar78 != 0)) {
    for (; (uVar78 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
    }
  }
  auVar105 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar198 = vinsertps_avx(auVar105,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar177 = auVar331._8_4_;
  fVar178 = auVar331._12_4_;
  fVar179 = *pfVar4 * 0.0;
  fVar180 = pfVar4[1] * 0.0;
  fVar181 = fVar177 * pfVar4[2];
  fVar285 = fVar178 * pfVar4[3];
  fVar286 = fVar179 + fVar207 * 0.0;
  fVar297 = fVar180 + fVar228 * 0.0;
  fVar298 = fVar181 + fVar161 * fVar177;
  fVar299 = fVar285 + fVar176 * fVar178;
  fVar300 = *pfVar3 * 0.0;
  fVar305 = pfVar3[1] * 0.0;
  fVar306 = fVar177 * pfVar3[2];
  fVar308 = fVar178 * pfVar3[3];
  local_660._0_4_ = fVar205 + fVar300 + fVar286;
  local_660._4_4_ = fVar226 + fVar305 + fVar297;
  fStack_658 = fVar206 + fVar306 + fVar298;
  fStack_654 = fVar227 + fVar308 + fVar299;
  auVar123._0_4_ = fVar286 + *pfVar3 * 3.0;
  auVar123._4_4_ = fVar297 + pfVar3[1] * 3.0;
  auVar123._8_4_ = fVar298 + pfVar3[2] * 3.0;
  auVar123._12_4_ = fVar299 + pfVar3[3] * 3.0;
  auVar287._0_4_ = fVar205 * 3.0;
  auVar287._4_4_ = fVar226 * 3.0;
  auVar287._8_4_ = fVar206 * 3.0;
  auVar287._12_4_ = fVar227 * 3.0;
  auVar149 = vsubps_avx(auVar123,auVar287);
  fVar298 = *pfVar2 * 0.0;
  fVar299 = pfVar2[1] * 0.0;
  fVar323 = pfVar2[2] * fVar177;
  fVar324 = pfVar2[3] * fVar178;
  fVar286 = fVar298 + fVar203 * 0.0;
  fVar297 = fVar299 + fVar224 * 0.0;
  fVar177 = fVar323 + fVar177 * fVar204;
  fVar178 = fVar324 + fVar178 * fVar225;
  fVar327 = *pfVar1 * 0.0;
  fVar332 = pfVar1[1] * 0.0;
  fVar334 = pfVar1[2] * 0.0;
  fVar336 = pfVar1[3] * 0.0;
  auVar337._0_4_ = fVar327 + fVar286 + fVar182;
  auVar337._4_4_ = fVar332 + fVar297 + fVar208;
  auVar337._8_4_ = fVar334 + fVar177 + fVar202;
  auVar337._12_4_ = fVar336 + fVar178 + fVar223;
  auVar139._0_4_ = fVar286 + *pfVar1 * 3.0;
  auVar139._4_4_ = fVar297 + pfVar1[1] * 3.0;
  auVar139._8_4_ = fVar177 + pfVar1[2] * 3.0;
  auVar139._12_4_ = fVar178 + pfVar1[3] * 3.0;
  auVar288._0_4_ = fVar182 * 3.0;
  auVar288._4_4_ = fVar208 * 3.0;
  auVar288._8_4_ = fVar202 * 3.0;
  auVar288._12_4_ = fVar223 * 3.0;
  auVar10 = vsubps_avx(auVar139,auVar288);
  auVar245._0_4_ = fVar205 * 0.0;
  auVar245._4_4_ = fVar226 * 0.0;
  auVar245._8_4_ = fVar206 * 0.0;
  auVar245._12_4_ = fVar227 * 0.0;
  auVar140._0_4_ = auVar245._0_4_ + fVar300 + fVar179 + fVar207;
  auVar140._4_4_ = auVar245._4_4_ + fVar305 + fVar180 + fVar228;
  auVar140._8_4_ = auVar245._8_4_ + fVar306 + fVar181 + fVar161;
  auVar140._12_4_ = auVar245._12_4_ + fVar308 + fVar285 + fVar176;
  auVar257._0_4_ = fVar207 * 3.0;
  auVar257._4_4_ = fVar228 * 3.0;
  auVar257._8_4_ = fVar161 * 3.0;
  auVar257._12_4_ = fVar176 * 3.0;
  auVar162._0_4_ = *pfVar4 * 3.0;
  auVar162._4_4_ = pfVar4[1] * 3.0;
  auVar162._8_4_ = pfVar4[2] * 3.0;
  auVar162._12_4_ = pfVar4[3] * 3.0;
  auVar105 = vsubps_avx(auVar257,auVar162);
  auVar163._0_4_ = fVar300 + auVar105._0_4_;
  auVar163._4_4_ = fVar305 + auVar105._4_4_;
  auVar163._8_4_ = fVar306 + auVar105._8_4_;
  auVar163._12_4_ = fVar308 + auVar105._12_4_;
  auVar84 = vsubps_avx(auVar163,auVar245);
  auVar185._0_4_ = fVar182 * 0.0;
  auVar185._4_4_ = fVar208 * 0.0;
  auVar185._8_4_ = fVar202 * 0.0;
  auVar185._12_4_ = fVar223 * 0.0;
  auVar258._0_4_ = fVar327 + fVar298 + fVar203 + auVar185._0_4_;
  auVar258._4_4_ = fVar332 + fVar299 + fVar224 + auVar185._4_4_;
  auVar258._8_4_ = fVar334 + fVar323 + fVar204 + auVar185._8_4_;
  auVar258._12_4_ = fVar336 + fVar324 + fVar225 + auVar185._12_4_;
  auVar229._0_4_ = fVar203 * 3.0;
  auVar229._4_4_ = fVar224 * 3.0;
  auVar229._8_4_ = fVar204 * 3.0;
  auVar229._12_4_ = fVar225 * 3.0;
  auVar210._0_4_ = *pfVar2 * 3.0;
  auVar210._4_4_ = pfVar2[1] * 3.0;
  auVar210._8_4_ = pfVar2[2] * 3.0;
  auVar210._12_4_ = pfVar2[3] * 3.0;
  auVar105 = vsubps_avx(auVar229,auVar210);
  auVar211._0_4_ = fVar327 + auVar105._0_4_;
  auVar211._4_4_ = fVar332 + auVar105._4_4_;
  auVar211._8_4_ = fVar334 + auVar105._8_4_;
  auVar211._12_4_ = fVar336 + auVar105._12_4_;
  auVar150 = vsubps_avx(auVar211,auVar185);
  auVar105 = vshufps_avx(auVar149,auVar149,0xc9);
  auVar289 = vshufps_avx(auVar337,auVar337,0xc9);
  fVar161 = auVar149._0_4_;
  auVar230._0_4_ = fVar161 * auVar289._0_4_;
  fVar176 = auVar149._4_4_;
  auVar230._4_4_ = fVar176 * auVar289._4_4_;
  fVar177 = auVar149._8_4_;
  auVar230._8_4_ = fVar177 * auVar289._8_4_;
  fVar178 = auVar149._12_4_;
  auVar230._12_4_ = fVar178 * auVar289._12_4_;
  auVar246._0_4_ = auVar337._0_4_ * auVar105._0_4_;
  auVar246._4_4_ = auVar337._4_4_ * auVar105._4_4_;
  auVar246._8_4_ = auVar337._8_4_ * auVar105._8_4_;
  auVar246._12_4_ = auVar337._12_4_ * auVar105._12_4_;
  auVar289 = vsubps_avx(auVar246,auVar230);
  auVar9 = vshufps_avx(auVar289,auVar289,0xc9);
  auVar289 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar231._0_4_ = fVar161 * auVar289._0_4_;
  auVar231._4_4_ = fVar176 * auVar289._4_4_;
  auVar231._8_4_ = fVar177 * auVar289._8_4_;
  auVar231._12_4_ = fVar178 * auVar289._12_4_;
  auVar186._0_4_ = auVar10._0_4_ * auVar105._0_4_;
  auVar186._4_4_ = auVar10._4_4_ * auVar105._4_4_;
  auVar186._8_4_ = auVar10._8_4_ * auVar105._8_4_;
  auVar186._12_4_ = auVar10._12_4_ * auVar105._12_4_;
  auVar105 = vsubps_avx(auVar186,auVar231);
  auVar10 = vshufps_avx(auVar105,auVar105,0xc9);
  auVar105 = vshufps_avx(auVar84,auVar84,0xc9);
  auVar289 = vshufps_avx(auVar258,auVar258,0xc9);
  fVar179 = auVar84._0_4_;
  auVar187._0_4_ = fVar179 * auVar289._0_4_;
  fVar180 = auVar84._4_4_;
  auVar187._4_4_ = fVar180 * auVar289._4_4_;
  fVar181 = auVar84._8_4_;
  auVar187._8_4_ = fVar181 * auVar289._8_4_;
  fVar285 = auVar84._12_4_;
  auVar187._12_4_ = fVar285 * auVar289._12_4_;
  auVar259._0_4_ = auVar258._0_4_ * auVar105._0_4_;
  auVar259._4_4_ = auVar258._4_4_ * auVar105._4_4_;
  auVar259._8_4_ = auVar258._8_4_ * auVar105._8_4_;
  auVar259._12_4_ = auVar258._12_4_ * auVar105._12_4_;
  auVar289 = vsubps_avx(auVar259,auVar187);
  auVar11 = vshufps_avx(auVar289,auVar289,0xc9);
  auVar289 = vshufps_avx(auVar150,auVar150,0xc9);
  auVar260._0_4_ = auVar289._0_4_ * fVar179;
  auVar260._4_4_ = auVar289._4_4_ * fVar180;
  auVar260._8_4_ = auVar289._8_4_ * fVar181;
  auVar260._12_4_ = auVar289._12_4_ * fVar285;
  auVar212._0_4_ = auVar105._0_4_ * auVar150._0_4_;
  auVar212._4_4_ = auVar105._4_4_ * auVar150._4_4_;
  auVar212._8_4_ = auVar105._8_4_ * auVar150._8_4_;
  auVar212._12_4_ = auVar105._12_4_ * auVar150._12_4_;
  auVar105 = vsubps_avx(auVar212,auVar260);
  auVar150 = vshufps_avx(auVar105,auVar105,0xc9);
  auVar105 = vdpps_avx(auVar9,auVar9,0x7f);
  fVar203 = auVar105._0_4_;
  auVar261 = ZEXT416((uint)fVar203);
  auVar289 = vrsqrtss_avx(auVar261,auVar261);
  fVar182 = auVar289._0_4_;
  auVar289 = vdpps_avx(auVar9,auVar10,0x7f);
  auVar104 = ZEXT416((uint)(fVar182 * 1.5 - fVar203 * 0.5 * fVar182 * fVar182 * fVar182));
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  fVar182 = auVar9._0_4_ * auVar104._0_4_;
  fVar208 = auVar9._4_4_ * auVar104._4_4_;
  fVar202 = auVar9._8_4_ * auVar104._8_4_;
  fVar223 = auVar9._12_4_ * auVar104._12_4_;
  auVar105 = vshufps_avx(auVar105,auVar105,0);
  auVar275._0_4_ = auVar10._0_4_ * auVar105._0_4_;
  auVar275._4_4_ = auVar10._4_4_ * auVar105._4_4_;
  auVar275._8_4_ = auVar10._8_4_ * auVar105._8_4_;
  auVar275._12_4_ = auVar10._12_4_ * auVar105._12_4_;
  auVar105 = vshufps_avx(auVar289,auVar289,0);
  auVar247._0_4_ = auVar9._0_4_ * auVar105._0_4_;
  auVar247._4_4_ = auVar9._4_4_ * auVar105._4_4_;
  auVar247._8_4_ = auVar9._8_4_ * auVar105._8_4_;
  auVar247._12_4_ = auVar9._12_4_ * auVar105._12_4_;
  auVar127 = vsubps_avx(auVar275,auVar247);
  auVar105 = vrcpss_avx(auVar261,auVar261);
  auVar105 = ZEXT416((uint)(auVar105._0_4_ * (2.0 - fVar203 * auVar105._0_4_)));
  auVar9 = vshufps_avx(auVar105,auVar105,0);
  auVar105 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar203 = auVar105._0_4_;
  auVar261 = ZEXT416((uint)fVar203);
  auVar289 = vrsqrtss_avx(auVar261,auVar261);
  fVar224 = auVar289._0_4_;
  auVar289 = ZEXT416((uint)(fVar224 * 1.5 - fVar203 * 0.5 * fVar224 * fVar224 * fVar224));
  auVar10 = vshufps_avx(auVar289,auVar289,0);
  fVar224 = auVar10._0_4_ * auVar11._0_4_;
  fVar204 = auVar10._4_4_ * auVar11._4_4_;
  fVar225 = auVar10._8_4_ * auVar11._8_4_;
  fVar205 = auVar10._12_4_ * auVar11._12_4_;
  auVar289 = vdpps_avx(auVar11,auVar150,0x7f);
  auVar105 = vshufps_avx(auVar105,auVar105,0);
  auVar232._0_4_ = auVar105._0_4_ * auVar150._0_4_;
  auVar232._4_4_ = auVar105._4_4_ * auVar150._4_4_;
  auVar232._8_4_ = auVar105._8_4_ * auVar150._8_4_;
  auVar232._12_4_ = auVar105._12_4_ * auVar150._12_4_;
  auVar105 = vshufps_avx(auVar289,auVar289,0);
  auVar188._0_4_ = auVar105._0_4_ * auVar11._0_4_;
  auVar188._4_4_ = auVar105._4_4_ * auVar11._4_4_;
  auVar188._8_4_ = auVar105._8_4_ * auVar11._8_4_;
  auVar188._12_4_ = auVar105._12_4_ * auVar11._12_4_;
  auVar150 = vsubps_avx(auVar232,auVar188);
  auVar105 = vrcpss_avx(auVar261,auVar261);
  auVar105 = ZEXT416((uint)((2.0 - fVar203 * auVar105._0_4_) * auVar105._0_4_));
  auVar105 = vshufps_avx(auVar105,auVar105,0);
  auVar289 = vshufps_avx(_local_660,_local_660,0xff);
  auVar262._0_4_ = auVar289._0_4_ * fVar182;
  auVar262._4_4_ = auVar289._4_4_ * fVar208;
  auVar262._8_4_ = auVar289._8_4_ * fVar202;
  auVar262._12_4_ = auVar289._12_4_ * fVar223;
  _local_480 = vsubps_avx(_local_660,auVar262);
  auVar11 = vshufps_avx(auVar149,auVar149,0xff);
  auVar213._0_4_ =
       auVar11._0_4_ * fVar182 + auVar104._0_4_ * auVar127._0_4_ * auVar9._0_4_ * auVar289._0_4_;
  auVar213._4_4_ =
       auVar11._4_4_ * fVar208 + auVar104._4_4_ * auVar127._4_4_ * auVar9._4_4_ * auVar289._4_4_;
  auVar213._8_4_ =
       auVar11._8_4_ * fVar202 + auVar104._8_4_ * auVar127._8_4_ * auVar9._8_4_ * auVar289._8_4_;
  auVar213._12_4_ =
       auVar11._12_4_ * fVar223 +
       auVar104._12_4_ * auVar127._12_4_ * auVar9._12_4_ * auVar289._12_4_;
  auVar11 = vsubps_avx(auVar149,auVar213);
  local_490._0_4_ = auVar262._0_4_ + (float)local_660._0_4_;
  local_490._4_4_ = auVar262._4_4_ + (float)local_660._4_4_;
  fStack_488 = auVar262._8_4_ + fStack_658;
  fStack_484 = auVar262._12_4_ + fStack_654;
  auVar289 = vshufps_avx(auVar140,auVar140,0xff);
  auVar124._0_4_ = fVar224 * auVar289._0_4_;
  auVar124._4_4_ = fVar204 * auVar289._4_4_;
  auVar124._8_4_ = fVar225 * auVar289._8_4_;
  auVar124._12_4_ = fVar205 * auVar289._12_4_;
  _local_4a0 = vsubps_avx(auVar140,auVar124);
  auVar9 = vshufps_avx(auVar84,auVar84,0xff);
  auVar98._0_4_ =
       fVar224 * auVar9._0_4_ + auVar289._0_4_ * auVar10._0_4_ * auVar150._0_4_ * auVar105._0_4_;
  auVar98._4_4_ =
       fVar204 * auVar9._4_4_ + auVar289._4_4_ * auVar10._4_4_ * auVar150._4_4_ * auVar105._4_4_;
  auVar98._8_4_ =
       fVar225 * auVar9._8_4_ + auVar289._8_4_ * auVar10._8_4_ * auVar150._8_4_ * auVar105._8_4_;
  auVar98._12_4_ =
       fVar205 * auVar9._12_4_ +
       auVar289._12_4_ * auVar10._12_4_ * auVar150._12_4_ * auVar105._12_4_;
  auVar10 = vsubps_avx(auVar84,auVar98);
  local_4b0._0_4_ = auVar140._0_4_ + auVar124._0_4_;
  local_4b0._4_4_ = auVar140._4_4_ + auVar124._4_4_;
  fStack_4a8 = auVar140._8_4_ + auVar124._8_4_;
  fStack_4a4 = auVar140._12_4_ + auVar124._12_4_;
  local_4c0._0_4_ = local_480._0_4_ + auVar11._0_4_ * 0.33333334;
  local_4c0._4_4_ = local_480._4_4_ + auVar11._4_4_ * 0.33333334;
  fStack_4b8 = local_480._8_4_ + auVar11._8_4_ * 0.33333334;
  fStack_4b4 = local_480._12_4_ + auVar11._12_4_ * 0.33333334;
  local_380 = vsubps_avx(_local_480,auVar198);
  auVar289 = vmovsldup_avx(local_380);
  auVar105 = vmovshdup_avx(local_380);
  auVar9 = vshufps_avx(local_380,local_380,0xaa);
  fVar182 = pre->ray_space[k].vx.field_0.m128[0];
  fVar208 = pre->ray_space[k].vx.field_0.m128[1];
  fVar202 = pre->ray_space[k].vx.field_0.m128[2];
  fVar223 = pre->ray_space[k].vx.field_0.m128[3];
  fVar203 = pre->ray_space[k].vy.field_0.m128[0];
  fVar224 = pre->ray_space[k].vy.field_0.m128[1];
  fVar204 = pre->ray_space[k].vy.field_0.m128[2];
  fVar225 = pre->ray_space[k].vy.field_0.m128[3];
  fVar205 = pre->ray_space[k].vz.field_0.m128[0];
  fVar226 = pre->ray_space[k].vz.field_0.m128[1];
  fVar206 = pre->ray_space[k].vz.field_0.m128[2];
  fVar227 = pre->ray_space[k].vz.field_0.m128[3];
  local_660._0_4_ = fVar182 * auVar289._0_4_ + auVar9._0_4_ * fVar205 + fVar203 * auVar105._0_4_;
  local_660._4_4_ = fVar208 * auVar289._4_4_ + auVar9._4_4_ * fVar226 + fVar224 * auVar105._4_4_;
  fStack_658 = fVar202 * auVar289._8_4_ + auVar9._8_4_ * fVar206 + fVar204 * auVar105._8_4_;
  fStack_654 = fVar223 * auVar289._12_4_ + auVar9._12_4_ * fVar227 + fVar225 * auVar105._12_4_;
  local_390 = vsubps_avx(_local_4c0,auVar198);
  auVar9 = vshufps_avx(local_390,local_390,0xaa);
  auVar105 = vmovshdup_avx(local_390);
  auVar289 = vmovsldup_avx(local_390);
  fVar207 = auVar289._0_4_ * fVar182 + auVar105._0_4_ * fVar203 + fVar205 * auVar9._0_4_;
  fVar228 = auVar289._4_4_ * fVar208 + auVar105._4_4_ * fVar224 + fVar226 * auVar9._4_4_;
  local_6a0._4_4_ = fVar228;
  local_6a0._0_4_ = fVar207;
  fStack_698 = auVar289._8_4_ * fVar202 + auVar105._8_4_ * fVar204 + fVar206 * auVar9._8_4_;
  fStack_694 = auVar289._12_4_ * fVar223 + auVar105._12_4_ * fVar225 + fVar227 * auVar9._12_4_;
  auVar189._0_4_ = auVar10._0_4_ * 0.33333334;
  auVar189._4_4_ = auVar10._4_4_ * 0.33333334;
  auVar189._8_4_ = auVar10._8_4_ * 0.33333334;
  auVar189._12_4_ = auVar10._12_4_ * 0.33333334;
  _local_4d0 = vsubps_avx(_local_4a0,auVar189);
  local_3a0 = vsubps_avx(_local_4d0,auVar198);
  auVar9 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar105 = vmovshdup_avx(local_3a0);
  auVar289 = vmovsldup_avx(local_3a0);
  auVar317._0_4_ = auVar289._0_4_ * fVar182 + auVar105._0_4_ * fVar203 + fVar205 * auVar9._0_4_;
  auVar317._4_4_ = auVar289._4_4_ * fVar208 + auVar105._4_4_ * fVar224 + fVar226 * auVar9._4_4_;
  auVar317._8_4_ = auVar289._8_4_ * fVar202 + auVar105._8_4_ * fVar204 + fVar206 * auVar9._8_4_;
  auVar317._12_4_ = auVar289._12_4_ * fVar223 + auVar105._12_4_ * fVar225 + fVar227 * auVar9._12_4_;
  local_3b0 = vsubps_avx(_local_4a0,auVar198);
  auVar9 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar105 = vmovshdup_avx(local_3b0);
  auVar289 = vmovsldup_avx(local_3b0);
  auVar301._0_4_ = auVar289._0_4_ * fVar182 + auVar105._0_4_ * fVar203 + auVar9._0_4_ * fVar205;
  auVar301._4_4_ = auVar289._4_4_ * fVar208 + auVar105._4_4_ * fVar224 + auVar9._4_4_ * fVar226;
  auVar301._8_4_ = auVar289._8_4_ * fVar202 + auVar105._8_4_ * fVar204 + auVar9._8_4_ * fVar206;
  auVar301._12_4_ = auVar289._12_4_ * fVar223 + auVar105._12_4_ * fVar225 + auVar9._12_4_ * fVar227;
  local_3c0 = vsubps_avx(_local_490,auVar198);
  auVar9 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar105 = vmovshdup_avx(local_3c0);
  auVar289 = vmovsldup_avx(local_3c0);
  auVar276._0_4_ = auVar289._0_4_ * fVar182 + auVar105._0_4_ * fVar203 + auVar9._0_4_ * fVar205;
  auVar276._4_4_ = auVar289._4_4_ * fVar208 + auVar105._4_4_ * fVar224 + auVar9._4_4_ * fVar226;
  auVar276._8_4_ = auVar289._8_4_ * fVar202 + auVar105._8_4_ * fVar204 + auVar9._8_4_ * fVar206;
  auVar276._12_4_ = auVar289._12_4_ * fVar223 + auVar105._12_4_ * fVar225 + auVar9._12_4_ * fVar227;
  local_4e0._0_4_ = (float)local_490._0_4_ + (fVar161 + auVar213._0_4_) * 0.33333334;
  local_4e0._4_4_ = (float)local_490._4_4_ + (fVar176 + auVar213._4_4_) * 0.33333334;
  fStack_4d8 = fStack_488 + (fVar177 + auVar213._8_4_) * 0.33333334;
  fStack_4d4 = fStack_484 + (fVar178 + auVar213._12_4_) * 0.33333334;
  local_3d0 = vsubps_avx(_local_4e0,auVar198);
  auVar9 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar105 = vmovshdup_avx(local_3d0);
  auVar289 = vmovsldup_avx(local_3d0);
  auVar248._0_4_ = auVar289._0_4_ * fVar182 + auVar105._0_4_ * fVar203 + auVar9._0_4_ * fVar205;
  auVar248._4_4_ = auVar289._4_4_ * fVar208 + auVar105._4_4_ * fVar224 + auVar9._4_4_ * fVar226;
  auVar248._8_4_ = auVar289._8_4_ * fVar202 + auVar105._8_4_ * fVar204 + auVar9._8_4_ * fVar206;
  auVar248._12_4_ = auVar289._12_4_ * fVar223 + auVar105._12_4_ * fVar225 + auVar9._12_4_ * fVar227;
  auVar233._0_4_ = (fVar179 + auVar98._0_4_) * 0.33333334;
  auVar233._4_4_ = (fVar180 + auVar98._4_4_) * 0.33333334;
  auVar233._8_4_ = (fVar181 + auVar98._8_4_) * 0.33333334;
  auVar233._12_4_ = (fVar285 + auVar98._12_4_) * 0.33333334;
  _local_410 = vsubps_avx(_local_4b0,auVar233);
  local_3e0 = vsubps_avx(_local_410,auVar198);
  auVar9 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar105 = vmovshdup_avx(local_3e0);
  auVar289 = vmovsldup_avx(local_3e0);
  auVar99._0_4_ = auVar289._0_4_ * fVar182 + auVar105._0_4_ * fVar203 + fVar205 * auVar9._0_4_;
  auVar99._4_4_ = auVar289._4_4_ * fVar208 + auVar105._4_4_ * fVar224 + fVar226 * auVar9._4_4_;
  auVar99._8_4_ = auVar289._8_4_ * fVar202 + auVar105._8_4_ * fVar204 + fVar206 * auVar9._8_4_;
  auVar99._12_4_ = auVar289._12_4_ * fVar223 + auVar105._12_4_ * fVar225 + fVar227 * auVar9._12_4_;
  local_3f0 = vsubps_avx(_local_4b0,auVar198);
  auVar198 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar105 = vmovshdup_avx(local_3f0);
  auVar289 = vmovsldup_avx(local_3f0);
  auVar82._0_4_ = fVar182 * auVar289._0_4_ + fVar203 * auVar105._0_4_ + fVar205 * auVar198._0_4_;
  auVar82._4_4_ = fVar208 * auVar289._4_4_ + fVar224 * auVar105._4_4_ + fVar226 * auVar198._4_4_;
  auVar82._8_4_ = fVar202 * auVar289._8_4_ + fVar204 * auVar105._8_4_ + fVar206 * auVar198._8_4_;
  auVar82._12_4_ = fVar223 * auVar289._12_4_ + fVar225 * auVar105._12_4_ + fVar227 * auVar198._12_4_
  ;
  auVar9 = vmovlhps_avx(_local_660,auVar276);
  auVar10 = vmovlhps_avx(_local_6a0,auVar248);
  auVar11 = vmovlhps_avx(auVar317,auVar99);
  _local_470 = vmovlhps_avx(auVar301,auVar82);
  auVar105 = vminps_avx(auVar9,auVar10);
  auVar289 = vminps_avx(auVar11,_local_470);
  auVar198 = vminps_avx(auVar105,auVar289);
  auVar105 = vmaxps_avx(auVar9,auVar10);
  auVar289 = vmaxps_avx(auVar11,_local_470);
  auVar105 = vmaxps_avx(auVar105,auVar289);
  auVar289 = vshufpd_avx(auVar198,auVar198,3);
  auVar198 = vminps_avx(auVar198,auVar289);
  auVar289 = vshufpd_avx(auVar105,auVar105,3);
  auVar289 = vmaxps_avx(auVar105,auVar289);
  auVar214._8_4_ = 0x7fffffff;
  auVar214._0_8_ = 0x7fffffff7fffffff;
  auVar214._12_4_ = 0x7fffffff;
  auVar105 = vandps_avx(auVar198,auVar214);
  auVar289 = vandps_avx(auVar289,auVar214);
  auVar105 = vmaxps_avx(auVar105,auVar289);
  auVar289 = vmovshdup_avx(auVar105);
  auVar105 = vmaxss_avx(auVar289,auVar105);
  fVar208 = auVar105._0_4_ * 9.536743e-07;
  auVar105 = vshufps_avx(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),0);
  local_280._16_16_ = auVar105;
  local_280._0_16_ = auVar105;
  auVar83._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
  auVar83._8_4_ = auVar105._8_4_ ^ 0x80000000;
  auVar83._12_4_ = auVar105._12_4_ ^ 0x80000000;
  local_2a0._16_16_ = auVar83;
  local_2a0._0_16_ = auVar83;
  auVar105 = vshufps_avx(ZEXT416(uVar71),ZEXT416(uVar71),0);
  local_2e0._16_16_ = auVar105;
  local_2e0._0_16_ = auVar105;
  auVar105 = vshufps_avx(ZEXT416(uVar77),ZEXT416(uVar77),0);
  local_300._16_16_ = auVar105;
  local_300._0_16_ = auVar105;
  uVar78 = 0;
  fVar182 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar10,auVar9);
  _local_360 = vsubps_avx(auVar11,auVar10);
  _local_370 = vsubps_avx(_local_470,auVar11);
  _local_420 = vsubps_avx(_local_490,_local_480);
  _local_430 = vsubps_avx(_local_4e0,_local_4c0);
  _local_440 = vsubps_avx(_local_410,_local_4d0);
  _local_450 = vsubps_avx(_local_4b0,_local_4a0);
  local_700 = ZEXT816(0x3f80000000000000);
  local_400 = local_700;
  do {
    auVar105 = vshufps_avx(local_700,local_700,0x50);
    auVar338._8_4_ = 0x3f800000;
    auVar338._0_8_ = &DAT_3f8000003f800000;
    auVar338._12_4_ = 0x3f800000;
    auVar341._16_4_ = 0x3f800000;
    auVar341._0_16_ = auVar338;
    auVar341._20_4_ = 0x3f800000;
    auVar341._24_4_ = 0x3f800000;
    auVar341._28_4_ = 0x3f800000;
    auVar289 = vsubps_avx(auVar338,auVar105);
    fVar202 = auVar105._0_4_;
    fVar223 = auVar105._4_4_;
    fVar203 = auVar105._8_4_;
    fVar224 = auVar105._12_4_;
    fVar204 = auVar289._0_4_;
    fVar225 = auVar289._4_4_;
    fVar205 = auVar289._8_4_;
    fVar226 = auVar289._12_4_;
    auVar125._0_4_ = auVar276._0_4_ * fVar202 + fVar204 * (float)local_660._0_4_;
    auVar125._4_4_ = auVar276._4_4_ * fVar223 + fVar225 * (float)local_660._4_4_;
    auVar125._8_4_ = auVar276._0_4_ * fVar203 + fVar205 * (float)local_660._0_4_;
    auVar125._12_4_ = auVar276._4_4_ * fVar224 + fVar226 * (float)local_660._4_4_;
    auVar100._0_4_ = auVar248._0_4_ * fVar202 + fVar207 * fVar204;
    auVar100._4_4_ = auVar248._4_4_ * fVar223 + fVar228 * fVar225;
    auVar100._8_4_ = auVar248._0_4_ * fVar203 + fVar207 * fVar205;
    auVar100._12_4_ = auVar248._4_4_ * fVar224 + fVar228 * fVar226;
    auVar234._0_4_ = auVar99._0_4_ * fVar202 + auVar317._0_4_ * fVar204;
    auVar234._4_4_ = auVar99._4_4_ * fVar223 + auVar317._4_4_ * fVar225;
    auVar234._8_4_ = auVar99._0_4_ * fVar203 + auVar317._0_4_ * fVar205;
    auVar234._12_4_ = auVar99._4_4_ * fVar224 + auVar317._4_4_ * fVar226;
    auVar141._0_4_ = auVar82._0_4_ * fVar202 + auVar301._0_4_ * fVar204;
    auVar141._4_4_ = auVar82._4_4_ * fVar223 + auVar301._4_4_ * fVar225;
    auVar141._8_4_ = auVar82._0_4_ * fVar203 + auVar301._0_4_ * fVar205;
    auVar141._12_4_ = auVar82._4_4_ * fVar224 + auVar301._4_4_ * fVar226;
    auVar105 = vmovshdup_avx(local_400);
    auVar289 = vshufps_avx(local_400,local_400,0);
    auVar255._16_16_ = auVar289;
    auVar255._0_16_ = auVar289;
    auVar198 = vshufps_avx(local_400,local_400,0x55);
    auVar90._16_16_ = auVar198;
    auVar90._0_16_ = auVar198;
    auVar86 = vsubps_avx(auVar90,auVar255);
    auVar198 = vshufps_avx(auVar125,auVar125,0);
    auVar150 = vshufps_avx(auVar125,auVar125,0x55);
    auVar104 = vshufps_avx(auVar100,auVar100,0);
    auVar149 = vshufps_avx(auVar100,auVar100,0x55);
    auVar84 = vshufps_avx(auVar234,auVar234,0);
    auVar127 = vshufps_avx(auVar234,auVar234,0x55);
    auVar261 = vshufps_avx(auVar141,auVar141,0);
    auVar81 = vshufps_avx(auVar141,auVar141,0x55);
    auVar105 = ZEXT416((uint)((auVar105._0_4_ - local_400._0_4_) * 0.04761905));
    auVar105 = vshufps_avx(auVar105,auVar105,0);
    auVar274._0_4_ = auVar289._0_4_ + auVar86._0_4_ * 0.0;
    auVar274._4_4_ = auVar289._4_4_ + auVar86._4_4_ * 0.14285715;
    auVar274._8_4_ = auVar289._8_4_ + auVar86._8_4_ * 0.2857143;
    auVar274._12_4_ = auVar289._12_4_ + auVar86._12_4_ * 0.42857146;
    auVar274._16_4_ = auVar289._0_4_ + auVar86._16_4_ * 0.5714286;
    auVar274._20_4_ = auVar289._4_4_ + auVar86._20_4_ * 0.71428573;
    auVar274._24_4_ = auVar289._8_4_ + auVar86._24_4_ * 0.8571429;
    auVar274._28_4_ = auVar289._12_4_ + auVar86._28_4_;
    auVar19 = vsubps_avx(auVar341,auVar274);
    fVar178 = auVar104._0_4_;
    fVar180 = auVar104._4_4_;
    fVar298 = auVar104._8_4_;
    fVar300 = auVar104._12_4_;
    fVar202 = auVar19._0_4_;
    fVar204 = auVar19._4_4_;
    fVar206 = auVar19._8_4_;
    fVar177 = auVar19._12_4_;
    fVar325 = auVar198._12_4_;
    fVar181 = auVar19._16_4_;
    fVar285 = auVar19._20_4_;
    fVar286 = auVar19._24_4_;
    fVar324 = auVar149._0_4_;
    fVar332 = auVar149._4_4_;
    fVar336 = auVar149._8_4_;
    fVar316 = auVar149._12_4_;
    local_680 = auVar150._0_4_;
    fStack_67c = auVar150._4_4_;
    fStack_678 = auVar150._8_4_;
    fStack_674 = auVar150._12_4_;
    fVar223 = auVar84._0_4_;
    fVar224 = auVar84._4_4_;
    fVar205 = auVar84._8_4_;
    fVar227 = auVar84._12_4_;
    fVar179 = auVar274._0_4_ * fVar223 + fVar178 * fVar202;
    fVar297 = auVar274._4_4_ * fVar224 + fVar180 * fVar204;
    fVar299 = auVar274._8_4_ * fVar205 + fVar298 * fVar206;
    fVar305 = auVar274._12_4_ * fVar227 + fVar300 * fVar177;
    fVar306 = auVar274._16_4_ * fVar223 + fVar178 * fVar181;
    fVar308 = auVar274._20_4_ * fVar224 + fVar180 * fVar285;
    fVar323 = auVar274._24_4_ * fVar205 + fVar298 * fVar286;
    fVar203 = auVar127._0_4_;
    fVar225 = auVar127._4_4_;
    fVar226 = auVar127._8_4_;
    fVar161 = auVar127._12_4_;
    fVar327 = auVar274._0_4_ * fVar203 + fVar324 * fVar202;
    fVar334 = auVar274._4_4_ * fVar225 + fVar332 * fVar204;
    fVar307 = auVar274._8_4_ * fVar226 + fVar336 * fVar206;
    fVar309 = auVar274._12_4_ * fVar161 + fVar316 * fVar177;
    fVar310 = auVar274._16_4_ * fVar203 + fVar324 * fVar181;
    fVar312 = auVar274._20_4_ * fVar225 + fVar332 * fVar285;
    fVar314 = auVar274._24_4_ * fVar226 + fVar336 * fVar286;
    auVar289 = vshufps_avx(auVar125,auVar125,0xaa);
    auVar150 = vshufps_avx(auVar125,auVar125,0xff);
    fVar176 = fVar227 + 0.0;
    auVar104 = vshufps_avx(auVar100,auVar100,0xaa);
    auVar149 = vshufps_avx(auVar100,auVar100,0xff);
    auVar91._0_4_ =
         fVar202 * (fVar178 * auVar274._0_4_ + auVar198._0_4_ * fVar202) + auVar274._0_4_ * fVar179;
    auVar91._4_4_ =
         fVar204 * (fVar180 * auVar274._4_4_ + auVar198._4_4_ * fVar204) + auVar274._4_4_ * fVar297;
    auVar91._8_4_ =
         fVar206 * (fVar298 * auVar274._8_4_ + auVar198._8_4_ * fVar206) + auVar274._8_4_ * fVar299;
    auVar91._12_4_ =
         fVar177 * (fVar300 * auVar274._12_4_ + fVar325 * fVar177) + auVar274._12_4_ * fVar305;
    auVar91._16_4_ =
         fVar181 * (fVar178 * auVar274._16_4_ + auVar198._0_4_ * fVar181) +
         auVar274._16_4_ * fVar306;
    auVar91._20_4_ =
         fVar285 * (fVar180 * auVar274._20_4_ + auVar198._4_4_ * fVar285) +
         auVar274._20_4_ * fVar308;
    auVar91._24_4_ =
         fVar286 * (fVar298 * auVar274._24_4_ + auVar198._8_4_ * fVar286) +
         auVar274._24_4_ * fVar323;
    auVar91._28_4_ = fVar325 + 1.0 + fVar161;
    auVar157._0_4_ =
         fVar202 * (fVar324 * auVar274._0_4_ + fVar202 * local_680) + auVar274._0_4_ * fVar327;
    auVar157._4_4_ =
         fVar204 * (fVar332 * auVar274._4_4_ + fVar204 * fStack_67c) + auVar274._4_4_ * fVar334;
    auVar157._8_4_ =
         fVar206 * (fVar336 * auVar274._8_4_ + fVar206 * fStack_678) + auVar274._8_4_ * fVar307;
    auVar157._12_4_ =
         fVar177 * (fVar316 * auVar274._12_4_ + fVar177 * fStack_674) + auVar274._12_4_ * fVar309;
    auVar157._16_4_ =
         fVar181 * (fVar324 * auVar274._16_4_ + fVar181 * local_680) + auVar274._16_4_ * fVar310;
    auVar157._20_4_ =
         fVar285 * (fVar332 * auVar274._20_4_ + fVar285 * fStack_67c) + auVar274._20_4_ * fVar312;
    auVar157._24_4_ =
         fVar286 * (fVar336 * auVar274._24_4_ + fVar286 * fStack_678) + auVar274._24_4_ * fVar314;
    auVar157._28_4_ = fVar325 + 1.0 + fVar161;
    auVar173._0_4_ =
         fVar202 * fVar179 + auVar274._0_4_ * (auVar261._0_4_ * auVar274._0_4_ + fVar202 * fVar223);
    auVar173._4_4_ =
         fVar204 * fVar297 + auVar274._4_4_ * (auVar261._4_4_ * auVar274._4_4_ + fVar204 * fVar224);
    auVar173._8_4_ =
         fVar206 * fVar299 + auVar274._8_4_ * (auVar261._8_4_ * auVar274._8_4_ + fVar206 * fVar205);
    auVar173._12_4_ =
         fVar177 * fVar305 +
         auVar274._12_4_ * (auVar261._12_4_ * auVar274._12_4_ + fVar177 * fVar227);
    auVar173._16_4_ =
         fVar181 * fVar306 +
         auVar274._16_4_ * (auVar261._0_4_ * auVar274._16_4_ + fVar181 * fVar223);
    auVar173._20_4_ =
         fVar285 * fVar308 +
         auVar274._20_4_ * (auVar261._4_4_ * auVar274._20_4_ + fVar285 * fVar224);
    auVar173._24_4_ =
         fVar286 * fVar323 +
         auVar274._24_4_ * (auVar261._8_4_ * auVar274._24_4_ + fVar286 * fVar205);
    auVar173._28_4_ = fVar161 + fVar176;
    auVar284._0_4_ =
         fVar202 * fVar327 + auVar274._0_4_ * (auVar81._0_4_ * auVar274._0_4_ + fVar202 * fVar203);
    auVar284._4_4_ =
         fVar204 * fVar334 + auVar274._4_4_ * (auVar81._4_4_ * auVar274._4_4_ + fVar204 * fVar225);
    auVar284._8_4_ =
         fVar206 * fVar307 + auVar274._8_4_ * (auVar81._8_4_ * auVar274._8_4_ + fVar206 * fVar226);
    auVar284._12_4_ =
         fVar177 * fVar309 +
         auVar274._12_4_ * (auVar81._12_4_ * auVar274._12_4_ + fVar177 * fVar161);
    auVar284._16_4_ =
         fVar181 * fVar310 + auVar274._16_4_ * (auVar81._0_4_ * auVar274._16_4_ + fVar181 * fVar203)
    ;
    auVar284._20_4_ =
         fVar285 * fVar312 + auVar274._20_4_ * (auVar81._4_4_ * auVar274._20_4_ + fVar285 * fVar225)
    ;
    auVar284._24_4_ =
         fVar286 * fVar314 + auVar274._24_4_ * (auVar81._8_4_ * auVar274._24_4_ + fVar286 * fVar226)
    ;
    auVar284._28_4_ = fVar176 + fVar161 + 0.0;
    local_1c0._0_4_ = fVar202 * auVar91._0_4_ + auVar274._0_4_ * auVar173._0_4_;
    local_1c0._4_4_ = fVar204 * auVar91._4_4_ + auVar274._4_4_ * auVar173._4_4_;
    local_1c0._8_4_ = fVar206 * auVar91._8_4_ + auVar274._8_4_ * auVar173._8_4_;
    local_1c0._12_4_ = fVar177 * auVar91._12_4_ + auVar274._12_4_ * auVar173._12_4_;
    local_1c0._16_4_ = fVar181 * auVar91._16_4_ + auVar274._16_4_ * auVar173._16_4_;
    local_1c0._20_4_ = fVar285 * auVar91._20_4_ + auVar274._20_4_ * auVar173._20_4_;
    local_1c0._24_4_ = fVar286 * auVar91._24_4_ + auVar274._24_4_ * auVar173._24_4_;
    local_1c0._28_4_ = fVar325 + fVar300 + fVar161 + 0.0;
    local_1e0._0_4_ = fVar202 * auVar157._0_4_ + auVar274._0_4_ * auVar284._0_4_;
    local_1e0._4_4_ = fVar204 * auVar157._4_4_ + auVar274._4_4_ * auVar284._4_4_;
    local_1e0._8_4_ = fVar206 * auVar157._8_4_ + auVar274._8_4_ * auVar284._8_4_;
    local_1e0._12_4_ = fVar177 * auVar157._12_4_ + auVar274._12_4_ * auVar284._12_4_;
    local_1e0._16_4_ = fVar181 * auVar157._16_4_ + auVar274._16_4_ * auVar284._16_4_;
    local_1e0._20_4_ = fVar285 * auVar157._20_4_ + auVar274._20_4_ * auVar284._20_4_;
    local_1e0._24_4_ = fVar286 * auVar157._24_4_ + auVar274._24_4_ * auVar284._24_4_;
    local_1e0._28_4_ = fVar325 + fVar300 + fVar176;
    auVar20 = vsubps_avx(auVar173,auVar91);
    auVar86 = vsubps_avx(auVar284,auVar157);
    local_640 = auVar105._0_4_;
    fStack_63c = auVar105._4_4_;
    fStack_638 = auVar105._8_4_;
    fStack_634 = auVar105._12_4_;
    local_220 = local_640 * auVar20._0_4_ * 3.0;
    fStack_21c = fStack_63c * auVar20._4_4_ * 3.0;
    auVar28._4_4_ = fStack_21c;
    auVar28._0_4_ = local_220;
    fStack_218 = fStack_638 * auVar20._8_4_ * 3.0;
    auVar28._8_4_ = fStack_218;
    fStack_214 = fStack_634 * auVar20._12_4_ * 3.0;
    auVar28._12_4_ = fStack_214;
    fStack_210 = local_640 * auVar20._16_4_ * 3.0;
    auVar28._16_4_ = fStack_210;
    fStack_20c = fStack_63c * auVar20._20_4_ * 3.0;
    auVar28._20_4_ = fStack_20c;
    fStack_208 = fStack_638 * auVar20._24_4_ * 3.0;
    auVar28._24_4_ = fStack_208;
    auVar28._28_4_ = auVar20._28_4_;
    fVar297 = local_640 * auVar86._0_4_ * 3.0;
    fVar298 = fStack_63c * auVar86._4_4_ * 3.0;
    auVar29._4_4_ = fVar298;
    auVar29._0_4_ = fVar297;
    fVar299 = fStack_638 * auVar86._8_4_ * 3.0;
    auVar29._8_4_ = fVar299;
    fVar300 = fStack_634 * auVar86._12_4_ * 3.0;
    auVar29._12_4_ = fVar300;
    fVar305 = local_640 * auVar86._16_4_ * 3.0;
    auVar29._16_4_ = fVar305;
    fVar306 = fStack_63c * auVar86._20_4_ * 3.0;
    auVar29._20_4_ = fVar306;
    fVar308 = fStack_638 * auVar86._24_4_ * 3.0;
    auVar29._24_4_ = fVar308;
    auVar29._28_4_ = auVar173._28_4_;
    auVar18 = vsubps_avx(local_1c0,auVar28);
    auVar86 = vperm2f128_avx(auVar18,auVar18,1);
    auVar86 = vshufps_avx(auVar86,auVar18,0x30);
    auVar86 = vshufps_avx(auVar18,auVar86,0x29);
    auVar21 = vsubps_avx(local_1e0,auVar29);
    auVar18 = vperm2f128_avx(auVar21,auVar21,1);
    auVar18 = vshufps_avx(auVar18,auVar21,0x30);
    auVar22 = vshufps_avx(auVar21,auVar18,0x29);
    fVar328 = auVar104._0_4_;
    fVar333 = auVar104._4_4_;
    fVar335 = auVar104._8_4_;
    fVar223 = auVar149._0_4_;
    fVar225 = auVar149._4_4_;
    fVar227 = auVar149._8_4_;
    fVar178 = auVar149._12_4_;
    fVar326 = auVar150._12_4_;
    auVar105 = vshufps_avx(auVar234,auVar234,0xaa);
    fVar203 = auVar105._0_4_;
    fVar205 = auVar105._4_4_;
    fVar161 = auVar105._8_4_;
    fVar179 = auVar105._12_4_;
    fVar309 = auVar274._0_4_ * fVar203 + fVar328 * fVar202;
    fVar310 = auVar274._4_4_ * fVar205 + fVar333 * fVar204;
    fVar312 = auVar274._8_4_ * fVar161 + fVar335 * fVar206;
    fVar314 = auVar274._12_4_ * fVar179 + auVar104._12_4_ * fVar177;
    fVar311 = auVar274._16_4_ * fVar203 + fVar328 * fVar181;
    fVar313 = auVar274._20_4_ * fVar205 + fVar333 * fVar285;
    fVar315 = auVar274._24_4_ * fVar161 + fVar335 * fVar286;
    fVar316 = fVar326 + fVar325 + fVar316;
    auVar105 = vshufps_avx(auVar234,auVar234,0xff);
    fVar224 = auVar105._0_4_;
    fVar226 = auVar105._4_4_;
    fVar176 = auVar105._8_4_;
    fVar180 = auVar105._12_4_;
    fVar323 = auVar274._0_4_ * fVar224 + fVar202 * fVar223;
    fVar324 = auVar274._4_4_ * fVar226 + fVar204 * fVar225;
    fVar327 = auVar274._8_4_ * fVar176 + fVar206 * fVar227;
    fVar332 = auVar274._12_4_ * fVar180 + fVar177 * fVar178;
    fVar334 = auVar274._16_4_ * fVar224 + fVar181 * fVar223;
    fVar336 = auVar274._20_4_ * fVar226 + fVar285 * fVar225;
    fVar307 = auVar274._24_4_ * fVar176 + fVar286 * fVar227;
    auVar105 = vshufps_avx(auVar141,auVar141,0xaa);
    auVar198 = vshufps_avx(auVar141,auVar141,0xff);
    fVar325 = auVar198._12_4_;
    auVar92._0_4_ =
         auVar274._0_4_ * fVar309 + fVar202 * (fVar328 * auVar274._0_4_ + auVar289._0_4_ * fVar202);
    auVar92._4_4_ =
         auVar274._4_4_ * fVar310 + fVar204 * (fVar333 * auVar274._4_4_ + auVar289._4_4_ * fVar204);
    auVar92._8_4_ =
         auVar274._8_4_ * fVar312 + fVar206 * (fVar335 * auVar274._8_4_ + auVar289._8_4_ * fVar206);
    auVar92._12_4_ =
         auVar274._12_4_ * fVar314 +
         fVar177 * (auVar104._12_4_ * auVar274._12_4_ + auVar289._12_4_ * fVar177);
    auVar92._16_4_ =
         auVar274._16_4_ * fVar311 +
         fVar181 * (fVar328 * auVar274._16_4_ + auVar289._0_4_ * fVar181);
    auVar92._20_4_ =
         auVar274._20_4_ * fVar313 +
         fVar285 * (fVar333 * auVar274._20_4_ + auVar289._4_4_ * fVar285);
    auVar92._24_4_ =
         auVar274._24_4_ * fVar315 +
         fVar286 * (fVar335 * auVar274._24_4_ + auVar289._8_4_ * fVar286);
    auVar92._28_4_ = fVar325 + auVar21._28_4_ + auVar18._28_4_;
    auVar322._0_4_ =
         auVar274._0_4_ * fVar323 + fVar202 * (auVar274._0_4_ * fVar223 + auVar150._0_4_ * fVar202);
    auVar322._4_4_ =
         auVar274._4_4_ * fVar324 + fVar204 * (auVar274._4_4_ * fVar225 + auVar150._4_4_ * fVar204);
    auVar322._8_4_ =
         auVar274._8_4_ * fVar327 + fVar206 * (auVar274._8_4_ * fVar227 + auVar150._8_4_ * fVar206);
    auVar322._12_4_ =
         auVar274._12_4_ * fVar332 + fVar177 * (auVar274._12_4_ * fVar178 + fVar326 * fVar177);
    auVar322._16_4_ =
         auVar274._16_4_ * fVar334 +
         fVar181 * (auVar274._16_4_ * fVar223 + auVar150._0_4_ * fVar181);
    auVar322._20_4_ =
         auVar274._20_4_ * fVar336 +
         fVar285 * (auVar274._20_4_ * fVar225 + auVar150._4_4_ * fVar285);
    auVar322._24_4_ =
         auVar274._24_4_ * fVar307 +
         fVar286 * (auVar274._24_4_ * fVar227 + auVar150._8_4_ * fVar286);
    auVar322._28_4_ = fVar325 + auVar18._28_4_ + auVar173._28_4_;
    auVar18 = vperm2f128_avx(local_1c0,local_1c0,1);
    auVar18 = vshufps_avx(auVar18,local_1c0,0x30);
    auVar23 = vshufps_avx(local_1c0,auVar18,0x29);
    auVar174._0_4_ =
         fVar202 * fVar309 + auVar274._0_4_ * (auVar105._0_4_ * auVar274._0_4_ + fVar202 * fVar203);
    auVar174._4_4_ =
         fVar204 * fVar310 + auVar274._4_4_ * (auVar105._4_4_ * auVar274._4_4_ + fVar204 * fVar205);
    auVar174._8_4_ =
         fVar206 * fVar312 + auVar274._8_4_ * (auVar105._8_4_ * auVar274._8_4_ + fVar206 * fVar161);
    auVar174._12_4_ =
         fVar177 * fVar314 +
         auVar274._12_4_ * (auVar105._12_4_ * auVar274._12_4_ + fVar177 * fVar179);
    auVar174._16_4_ =
         fVar181 * fVar311 +
         auVar274._16_4_ * (auVar105._0_4_ * auVar274._16_4_ + fVar181 * fVar203);
    auVar174._20_4_ =
         fVar285 * fVar313 +
         auVar274._20_4_ * (auVar105._4_4_ * auVar274._20_4_ + fVar285 * fVar205);
    auVar174._24_4_ =
         fVar286 * fVar315 +
         auVar274._24_4_ * (auVar105._8_4_ * auVar274._24_4_ + fVar286 * fVar161);
    auVar174._28_4_ = fVar316 + auVar105._12_4_ + fVar179;
    auVar222._0_4_ =
         fVar202 * fVar323 + auVar274._0_4_ * (auVar198._0_4_ * auVar274._0_4_ + fVar202 * fVar224);
    auVar222._4_4_ =
         fVar204 * fVar324 + auVar274._4_4_ * (auVar198._4_4_ * auVar274._4_4_ + fVar204 * fVar226);
    auVar222._8_4_ =
         fVar206 * fVar327 + auVar274._8_4_ * (auVar198._8_4_ * auVar274._8_4_ + fVar206 * fVar176);
    auVar222._12_4_ =
         fVar177 * fVar332 + auVar274._12_4_ * (fVar325 * auVar274._12_4_ + fVar177 * fVar180);
    auVar222._16_4_ =
         fVar181 * fVar334 +
         auVar274._16_4_ * (auVar198._0_4_ * auVar274._16_4_ + fVar181 * fVar224);
    auVar222._20_4_ =
         fVar285 * fVar336 +
         auVar274._20_4_ * (auVar198._4_4_ * auVar274._20_4_ + fVar285 * fVar226);
    auVar222._24_4_ =
         fVar286 * fVar307 +
         auVar274._24_4_ * (auVar198._8_4_ * auVar274._24_4_ + fVar286 * fVar176);
    auVar222._28_4_ = fVar326 + fVar178 + fVar325 + fVar180;
    auVar244._0_4_ = fVar202 * auVar92._0_4_ + auVar274._0_4_ * auVar174._0_4_;
    auVar244._4_4_ = fVar204 * auVar92._4_4_ + auVar274._4_4_ * auVar174._4_4_;
    auVar244._8_4_ = fVar206 * auVar92._8_4_ + auVar274._8_4_ * auVar174._8_4_;
    auVar244._12_4_ = fVar177 * auVar92._12_4_ + auVar274._12_4_ * auVar174._12_4_;
    auVar244._16_4_ = fVar181 * auVar92._16_4_ + auVar274._16_4_ * auVar174._16_4_;
    auVar244._20_4_ = fVar285 * auVar92._20_4_ + auVar274._20_4_ * auVar174._20_4_;
    auVar244._24_4_ = fVar286 * auVar92._24_4_ + auVar274._24_4_ * auVar174._24_4_;
    auVar244._28_4_ = fVar316 + fVar325 + fVar180;
    auVar256._0_4_ = fVar202 * auVar322._0_4_ + auVar274._0_4_ * auVar222._0_4_;
    auVar256._4_4_ = fVar204 * auVar322._4_4_ + auVar274._4_4_ * auVar222._4_4_;
    auVar256._8_4_ = fVar206 * auVar322._8_4_ + auVar274._8_4_ * auVar222._8_4_;
    auVar256._12_4_ = fVar177 * auVar322._12_4_ + auVar274._12_4_ * auVar222._12_4_;
    auVar256._16_4_ = fVar181 * auVar322._16_4_ + auVar274._16_4_ * auVar222._16_4_;
    auVar256._20_4_ = fVar285 * auVar322._20_4_ + auVar274._20_4_ * auVar222._20_4_;
    auVar256._24_4_ = fVar286 * auVar322._24_4_ + auVar274._24_4_ * auVar222._24_4_;
    auVar256._28_4_ = auVar19._28_4_ + auVar274._28_4_;
    auVar18 = vsubps_avx(auVar174,auVar92);
    auVar19 = vsubps_avx(auVar222,auVar322);
    local_240 = local_640 * auVar18._0_4_ * 3.0;
    fStack_23c = fStack_63c * auVar18._4_4_ * 3.0;
    auVar30._4_4_ = fStack_23c;
    auVar30._0_4_ = local_240;
    fStack_238 = fStack_638 * auVar18._8_4_ * 3.0;
    auVar30._8_4_ = fStack_238;
    fStack_234 = fStack_634 * auVar18._12_4_ * 3.0;
    auVar30._12_4_ = fStack_234;
    fStack_230 = local_640 * auVar18._16_4_ * 3.0;
    auVar30._16_4_ = fStack_230;
    fStack_22c = fStack_63c * auVar18._20_4_ * 3.0;
    auVar30._20_4_ = fStack_22c;
    fStack_228 = fStack_638 * auVar18._24_4_ * 3.0;
    auVar30._24_4_ = fStack_228;
    auVar30._28_4_ = auVar222._28_4_;
    local_260 = local_640 * auVar19._0_4_ * 3.0;
    fStack_25c = fStack_63c * auVar19._4_4_ * 3.0;
    auVar31._4_4_ = fStack_25c;
    auVar31._0_4_ = local_260;
    fStack_258 = fStack_638 * auVar19._8_4_ * 3.0;
    auVar31._8_4_ = fStack_258;
    fStack_254 = fStack_634 * auVar19._12_4_ * 3.0;
    auVar31._12_4_ = fStack_254;
    local_640 = local_640 * auVar19._16_4_ * 3.0;
    auVar31._16_4_ = local_640;
    fStack_63c = fStack_63c * auVar19._20_4_ * 3.0;
    auVar31._20_4_ = fStack_63c;
    fStack_638 = fStack_638 * auVar19._24_4_ * 3.0;
    auVar31._24_4_ = fStack_638;
    auVar31._28_4_ = fStack_634;
    auVar18 = vperm2f128_avx(auVar244,auVar244,1);
    auVar18 = vshufps_avx(auVar18,auVar244,0x30);
    auVar24 = vshufps_avx(auVar244,auVar18,0x29);
    auVar19 = vsubps_avx(auVar244,auVar30);
    auVar18 = vperm2f128_avx(auVar19,auVar19,1);
    auVar18 = vshufps_avx(auVar18,auVar19,0x30);
    auVar25 = vshufps_avx(auVar19,auVar18,0x29);
    auVar19 = vsubps_avx(auVar256,auVar31);
    auVar18 = vperm2f128_avx(auVar19,auVar19,1);
    auVar18 = vshufps_avx(auVar18,auVar19,0x30);
    auVar26 = vshufps_avx(auVar19,auVar18,0x29);
    auVar21 = vsubps_avx(auVar244,local_1c0);
    auVar87 = vsubps_avx(auVar24,auVar23);
    fVar202 = auVar87._0_4_ + auVar21._0_4_;
    fVar223 = auVar87._4_4_ + auVar21._4_4_;
    fVar203 = auVar87._8_4_ + auVar21._8_4_;
    fVar224 = auVar87._12_4_ + auVar21._12_4_;
    fVar204 = auVar87._16_4_ + auVar21._16_4_;
    fVar225 = auVar87._20_4_ + auVar21._20_4_;
    fVar205 = auVar87._24_4_ + auVar21._24_4_;
    auVar19 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar19 = vshufps_avx(auVar19,local_1e0,0x30);
    local_200 = vshufps_avx(local_1e0,auVar19,0x29);
    auVar19 = vperm2f128_avx(auVar256,auVar256,1);
    auVar19 = vshufps_avx(auVar19,auVar256,0x30);
    auVar27 = vshufps_avx(auVar256,auVar19,0x29);
    auVar19 = vsubps_avx(auVar256,local_1e0);
    auVar88 = vsubps_avx(auVar27,local_200);
    fVar226 = auVar19._0_4_ + auVar88._0_4_;
    fVar206 = auVar19._4_4_ + auVar88._4_4_;
    fVar227 = auVar19._8_4_ + auVar88._8_4_;
    fVar161 = auVar19._12_4_ + auVar88._12_4_;
    fVar176 = auVar19._16_4_ + auVar88._16_4_;
    fVar177 = auVar19._20_4_ + auVar88._20_4_;
    fVar178 = auVar19._24_4_ + auVar88._24_4_;
    fVar179 = auVar19._28_4_;
    auVar32._4_4_ = local_1e0._4_4_ * fVar223;
    auVar32._0_4_ = local_1e0._0_4_ * fVar202;
    auVar32._8_4_ = local_1e0._8_4_ * fVar203;
    auVar32._12_4_ = local_1e0._12_4_ * fVar224;
    auVar32._16_4_ = local_1e0._16_4_ * fVar204;
    auVar32._20_4_ = local_1e0._20_4_ * fVar225;
    auVar32._24_4_ = local_1e0._24_4_ * fVar205;
    auVar32._28_4_ = fVar179;
    auVar33._4_4_ = fVar206 * local_1c0._4_4_;
    auVar33._0_4_ = fVar226 * local_1c0._0_4_;
    auVar33._8_4_ = fVar227 * local_1c0._8_4_;
    auVar33._12_4_ = fVar161 * local_1c0._12_4_;
    auVar33._16_4_ = fVar176 * local_1c0._16_4_;
    auVar33._20_4_ = fVar177 * local_1c0._20_4_;
    auVar33._24_4_ = fVar178 * local_1c0._24_4_;
    auVar33._28_4_ = auVar18._28_4_;
    auVar19 = vsubps_avx(auVar32,auVar33);
    local_220 = local_1c0._0_4_ + local_220;
    fStack_21c = local_1c0._4_4_ + fStack_21c;
    fStack_218 = local_1c0._8_4_ + fStack_218;
    fStack_214 = local_1c0._12_4_ + fStack_214;
    fStack_210 = local_1c0._16_4_ + fStack_210;
    fStack_20c = local_1c0._20_4_ + fStack_20c;
    fStack_208 = local_1c0._24_4_ + fStack_208;
    fStack_204 = local_1c0._28_4_ + auVar20._28_4_;
    fVar297 = local_1e0._0_4_ + fVar297;
    fVar298 = local_1e0._4_4_ + fVar298;
    fVar299 = local_1e0._8_4_ + fVar299;
    fVar300 = local_1e0._12_4_ + fVar300;
    fVar305 = local_1e0._16_4_ + fVar305;
    fVar306 = local_1e0._20_4_ + fVar306;
    fVar308 = local_1e0._24_4_ + fVar308;
    auVar34._4_4_ = fVar298 * fVar223;
    auVar34._0_4_ = fVar297 * fVar202;
    auVar34._8_4_ = fVar299 * fVar203;
    auVar34._12_4_ = fVar300 * fVar224;
    auVar34._16_4_ = fVar305 * fVar204;
    auVar34._20_4_ = fVar306 * fVar225;
    auVar34._24_4_ = fVar308 * fVar205;
    auVar34._28_4_ = fVar179;
    auVar35._4_4_ = fVar206 * fStack_21c;
    auVar35._0_4_ = fVar226 * local_220;
    auVar35._8_4_ = fVar227 * fStack_218;
    auVar35._12_4_ = fVar161 * fStack_214;
    auVar35._16_4_ = fVar176 * fStack_210;
    auVar35._20_4_ = fVar177 * fStack_20c;
    auVar35._24_4_ = fVar178 * fStack_208;
    auVar35._28_4_ = fStack_204;
    auVar20 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar22._4_4_ * fVar223;
    auVar36._0_4_ = auVar22._0_4_ * fVar202;
    auVar36._8_4_ = auVar22._8_4_ * fVar203;
    auVar36._12_4_ = auVar22._12_4_ * fVar224;
    auVar36._16_4_ = auVar22._16_4_ * fVar204;
    auVar36._20_4_ = auVar22._20_4_ * fVar225;
    auVar36._24_4_ = auVar22._24_4_ * fVar205;
    auVar36._28_4_ = fVar179;
    local_680 = auVar86._0_4_;
    fStack_67c = auVar86._4_4_;
    fStack_678 = auVar86._8_4_;
    fStack_674 = auVar86._12_4_;
    fStack_670 = auVar86._16_4_;
    fStack_66c = auVar86._20_4_;
    fStack_668 = auVar86._24_4_;
    auVar37._4_4_ = fVar206 * fStack_67c;
    auVar37._0_4_ = fVar226 * local_680;
    auVar37._8_4_ = fVar227 * fStack_678;
    auVar37._12_4_ = fVar161 * fStack_674;
    auVar37._16_4_ = fVar176 * fStack_670;
    auVar37._20_4_ = fVar177 * fStack_66c;
    auVar37._24_4_ = fVar178 * fStack_668;
    auVar37._28_4_ = 0x40400000;
    auVar115 = vsubps_avx(auVar36,auVar37);
    auVar38._4_4_ = local_200._4_4_ * fVar223;
    auVar38._0_4_ = local_200._0_4_ * fVar202;
    auVar38._8_4_ = local_200._8_4_ * fVar203;
    auVar38._12_4_ = local_200._12_4_ * fVar224;
    auVar38._16_4_ = local_200._16_4_ * fVar204;
    auVar38._20_4_ = local_200._20_4_ * fVar225;
    auVar38._24_4_ = local_200._24_4_ * fVar205;
    auVar38._28_4_ = fVar179;
    auVar39._4_4_ = auVar23._4_4_ * fVar206;
    auVar39._0_4_ = auVar23._0_4_ * fVar226;
    auVar39._8_4_ = auVar23._8_4_ * fVar227;
    auVar39._12_4_ = auVar23._12_4_ * fVar161;
    auVar39._16_4_ = auVar23._16_4_ * fVar176;
    auVar39._20_4_ = auVar23._20_4_ * fVar177;
    auVar39._24_4_ = auVar23._24_4_ * fVar178;
    auVar39._28_4_ = local_200._28_4_;
    auVar116 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = auVar256._4_4_ * fVar223;
    auVar40._0_4_ = auVar256._0_4_ * fVar202;
    auVar40._8_4_ = auVar256._8_4_ * fVar203;
    auVar40._12_4_ = auVar256._12_4_ * fVar224;
    auVar40._16_4_ = auVar256._16_4_ * fVar204;
    auVar40._20_4_ = auVar256._20_4_ * fVar225;
    auVar40._24_4_ = auVar256._24_4_ * fVar205;
    auVar40._28_4_ = fVar179;
    auVar41._4_4_ = fVar206 * auVar244._4_4_;
    auVar41._0_4_ = fVar226 * auVar244._0_4_;
    auVar41._8_4_ = fVar227 * auVar244._8_4_;
    auVar41._12_4_ = fVar161 * auVar244._12_4_;
    auVar41._16_4_ = fVar176 * auVar244._16_4_;
    auVar41._20_4_ = fVar177 * auVar244._20_4_;
    auVar41._24_4_ = fVar178 * auVar244._24_4_;
    auVar41._28_4_ = auVar22._28_4_;
    auVar117 = vsubps_avx(auVar40,auVar41);
    local_240 = auVar244._0_4_ + local_240;
    fStack_23c = auVar244._4_4_ + fStack_23c;
    fStack_238 = auVar244._8_4_ + fStack_238;
    fStack_234 = auVar244._12_4_ + fStack_234;
    fStack_230 = auVar244._16_4_ + fStack_230;
    fStack_22c = auVar244._20_4_ + fStack_22c;
    fStack_228 = auVar244._24_4_ + fStack_228;
    fStack_224 = auVar244._28_4_ + auVar222._28_4_;
    local_260 = auVar256._0_4_ + local_260;
    fStack_25c = auVar256._4_4_ + fStack_25c;
    fStack_258 = auVar256._8_4_ + fStack_258;
    fStack_254 = auVar256._12_4_ + fStack_254;
    fStack_250 = auVar256._16_4_ + local_640;
    fStack_24c = auVar256._20_4_ + fStack_63c;
    fStack_248 = auVar256._24_4_ + fStack_638;
    fStack_244 = auVar256._28_4_ + fStack_634;
    auVar42._4_4_ = fStack_25c * fVar223;
    auVar42._0_4_ = local_260 * fVar202;
    auVar42._8_4_ = fStack_258 * fVar203;
    auVar42._12_4_ = fStack_254 * fVar224;
    auVar42._16_4_ = fStack_250 * fVar204;
    auVar42._20_4_ = fStack_24c * fVar225;
    auVar42._24_4_ = fStack_248 * fVar205;
    auVar42._28_4_ = auVar256._28_4_ + fStack_634;
    auVar43._4_4_ = fStack_23c * fVar206;
    auVar43._0_4_ = local_240 * fVar226;
    auVar43._8_4_ = fStack_238 * fVar227;
    auVar43._12_4_ = fStack_234 * fVar161;
    auVar43._16_4_ = fStack_230 * fVar176;
    auVar43._20_4_ = fStack_22c * fVar177;
    auVar43._24_4_ = fStack_228 * fVar178;
    auVar43._28_4_ = fStack_224;
    auVar118 = vsubps_avx(auVar42,auVar43);
    auVar44._4_4_ = auVar26._4_4_ * fVar223;
    auVar44._0_4_ = auVar26._0_4_ * fVar202;
    auVar44._8_4_ = auVar26._8_4_ * fVar203;
    auVar44._12_4_ = auVar26._12_4_ * fVar224;
    auVar44._16_4_ = auVar26._16_4_ * fVar204;
    auVar44._20_4_ = auVar26._20_4_ * fVar225;
    auVar44._24_4_ = auVar26._24_4_ * fVar205;
    auVar44._28_4_ = fStack_224;
    auVar45._4_4_ = fVar206 * auVar25._4_4_;
    auVar45._0_4_ = fVar226 * auVar25._0_4_;
    auVar45._8_4_ = fVar227 * auVar25._8_4_;
    auVar45._12_4_ = fVar161 * auVar25._12_4_;
    auVar45._16_4_ = fVar176 * auVar25._16_4_;
    auVar45._20_4_ = fVar177 * auVar25._20_4_;
    auVar45._24_4_ = fVar178 * auVar25._24_4_;
    auVar45._28_4_ = auVar25._28_4_;
    auVar132 = vsubps_avx(auVar44,auVar45);
    auVar46._4_4_ = auVar27._4_4_ * fVar223;
    auVar46._0_4_ = auVar27._0_4_ * fVar202;
    auVar46._8_4_ = auVar27._8_4_ * fVar203;
    auVar46._12_4_ = auVar27._12_4_ * fVar224;
    auVar46._16_4_ = auVar27._16_4_ * fVar204;
    auVar46._20_4_ = auVar27._20_4_ * fVar225;
    auVar46._24_4_ = auVar27._24_4_ * fVar205;
    auVar46._28_4_ = auVar87._28_4_ + auVar21._28_4_;
    auVar47._4_4_ = auVar24._4_4_ * fVar206;
    auVar47._0_4_ = auVar24._0_4_ * fVar226;
    auVar47._8_4_ = auVar24._8_4_ * fVar227;
    auVar47._12_4_ = auVar24._12_4_ * fVar161;
    auVar47._16_4_ = auVar24._16_4_ * fVar176;
    auVar47._20_4_ = auVar24._20_4_ * fVar177;
    auVar47._24_4_ = auVar24._24_4_ * fVar178;
    auVar47._28_4_ = fVar179 + auVar88._28_4_;
    auVar87 = vsubps_avx(auVar46,auVar47);
    auVar18 = vminps_avx(auVar19,auVar20);
    auVar86 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vminps_avx(auVar115,auVar116);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar115,auVar116);
    auVar86 = vmaxps_avx(auVar86,auVar18);
    auVar20 = vminps_avx(auVar117,auVar118);
    auVar18 = vmaxps_avx(auVar117,auVar118);
    auVar21 = vminps_avx(auVar132,auVar87);
    auVar20 = vminps_avx(auVar20,auVar21);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar132,auVar87);
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar86,auVar18);
    auVar86 = vcmpps_avx(auVar20,local_280,2);
    auVar18 = vcmpps_avx(auVar18,local_2a0,5);
    auVar86 = vandps_avx(auVar18,auVar86);
    auVar18 = local_340 & auVar86;
    uVar72 = 0;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar18 = vsubps_avx(auVar23,local_1c0);
      auVar19 = vsubps_avx(auVar24,auVar244);
      fVar223 = auVar18._0_4_ + auVar19._0_4_;
      fVar203 = auVar18._4_4_ + auVar19._4_4_;
      fVar224 = auVar18._8_4_ + auVar19._8_4_;
      fVar204 = auVar18._12_4_ + auVar19._12_4_;
      fVar225 = auVar18._16_4_ + auVar19._16_4_;
      fVar205 = auVar18._20_4_ + auVar19._20_4_;
      fVar226 = auVar18._24_4_ + auVar19._24_4_;
      auVar20 = vsubps_avx(local_200,local_1e0);
      auVar21 = vsubps_avx(auVar27,auVar256);
      fVar206 = auVar20._0_4_ + auVar21._0_4_;
      fVar227 = auVar20._4_4_ + auVar21._4_4_;
      fVar161 = auVar20._8_4_ + auVar21._8_4_;
      fVar176 = auVar20._12_4_ + auVar21._12_4_;
      fVar177 = auVar20._16_4_ + auVar21._16_4_;
      fVar178 = auVar20._20_4_ + auVar21._20_4_;
      fVar179 = auVar20._24_4_ + auVar21._24_4_;
      fVar202 = auVar21._28_4_;
      auVar48._4_4_ = local_1e0._4_4_ * fVar203;
      auVar48._0_4_ = local_1e0._0_4_ * fVar223;
      auVar48._8_4_ = local_1e0._8_4_ * fVar224;
      auVar48._12_4_ = local_1e0._12_4_ * fVar204;
      auVar48._16_4_ = local_1e0._16_4_ * fVar225;
      auVar48._20_4_ = local_1e0._20_4_ * fVar205;
      auVar48._24_4_ = local_1e0._24_4_ * fVar226;
      auVar48._28_4_ = local_1e0._28_4_;
      auVar49._4_4_ = local_1c0._4_4_ * fVar227;
      auVar49._0_4_ = local_1c0._0_4_ * fVar206;
      auVar49._8_4_ = local_1c0._8_4_ * fVar161;
      auVar49._12_4_ = local_1c0._12_4_ * fVar176;
      auVar49._16_4_ = local_1c0._16_4_ * fVar177;
      auVar49._20_4_ = local_1c0._20_4_ * fVar178;
      auVar49._24_4_ = local_1c0._24_4_ * fVar179;
      auVar49._28_4_ = local_1c0._28_4_;
      auVar21 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = fVar298 * fVar203;
      auVar50._0_4_ = fVar297 * fVar223;
      auVar50._8_4_ = fVar299 * fVar224;
      auVar50._12_4_ = fVar300 * fVar204;
      auVar50._16_4_ = fVar305 * fVar225;
      auVar50._20_4_ = fVar306 * fVar205;
      auVar50._24_4_ = fVar308 * fVar226;
      auVar50._28_4_ = local_1e0._28_4_;
      auVar51._4_4_ = fVar227 * fStack_21c;
      auVar51._0_4_ = fVar206 * local_220;
      auVar51._8_4_ = fVar161 * fStack_218;
      auVar51._12_4_ = fVar176 * fStack_214;
      auVar51._16_4_ = fVar177 * fStack_210;
      auVar51._20_4_ = fVar178 * fStack_20c;
      auVar51._24_4_ = fVar179 * fStack_208;
      auVar51._28_4_ = fVar202;
      auVar87 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = fVar203 * auVar22._4_4_;
      auVar52._0_4_ = fVar223 * auVar22._0_4_;
      auVar52._8_4_ = fVar224 * auVar22._8_4_;
      auVar52._12_4_ = fVar204 * auVar22._12_4_;
      auVar52._16_4_ = fVar225 * auVar22._16_4_;
      auVar52._20_4_ = fVar205 * auVar22._20_4_;
      auVar52._24_4_ = fVar226 * auVar22._24_4_;
      auVar52._28_4_ = fVar202;
      auVar53._4_4_ = fVar227 * fStack_67c;
      auVar53._0_4_ = fVar206 * local_680;
      auVar53._8_4_ = fVar161 * fStack_678;
      auVar53._12_4_ = fVar176 * fStack_674;
      auVar53._16_4_ = fVar177 * fStack_670;
      auVar53._20_4_ = fVar178 * fStack_66c;
      auVar53._24_4_ = fVar179 * fStack_668;
      auVar53._28_4_ = local_1e0._28_4_ + auVar173._28_4_;
      auVar22 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = local_200._4_4_ * fVar203;
      auVar54._0_4_ = local_200._0_4_ * fVar223;
      auVar54._8_4_ = local_200._8_4_ * fVar224;
      auVar54._12_4_ = local_200._12_4_ * fVar204;
      auVar54._16_4_ = local_200._16_4_ * fVar225;
      auVar54._20_4_ = local_200._20_4_ * fVar205;
      auVar54._24_4_ = local_200._24_4_ * fVar226;
      auVar54._28_4_ = local_1e0._28_4_ + auVar173._28_4_;
      auVar55._4_4_ = auVar23._4_4_ * fVar227;
      auVar55._0_4_ = auVar23._0_4_ * fVar206;
      auVar55._8_4_ = auVar23._8_4_ * fVar161;
      auVar55._12_4_ = auVar23._12_4_ * fVar176;
      auVar55._16_4_ = auVar23._16_4_ * fVar177;
      auVar55._20_4_ = auVar23._20_4_ * fVar178;
      uVar6 = auVar23._28_4_;
      auVar55._24_4_ = auVar23._24_4_ * fVar179;
      auVar55._28_4_ = uVar6;
      auVar23 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = auVar256._4_4_ * fVar203;
      auVar56._0_4_ = auVar256._0_4_ * fVar223;
      auVar56._8_4_ = auVar256._8_4_ * fVar224;
      auVar56._12_4_ = auVar256._12_4_ * fVar204;
      auVar56._16_4_ = auVar256._16_4_ * fVar225;
      auVar56._20_4_ = auVar256._20_4_ * fVar205;
      auVar56._24_4_ = auVar256._24_4_ * fVar226;
      auVar56._28_4_ = auVar256._28_4_;
      auVar57._4_4_ = auVar244._4_4_ * fVar227;
      auVar57._0_4_ = auVar244._0_4_ * fVar206;
      auVar57._8_4_ = auVar244._8_4_ * fVar161;
      auVar57._12_4_ = auVar244._12_4_ * fVar176;
      auVar57._16_4_ = auVar244._16_4_ * fVar177;
      auVar57._20_4_ = auVar244._20_4_ * fVar178;
      auVar57._24_4_ = auVar244._24_4_ * fVar179;
      auVar57._28_4_ = auVar244._28_4_;
      auVar88 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = fVar203 * fStack_25c;
      auVar58._0_4_ = fVar223 * local_260;
      auVar58._8_4_ = fVar224 * fStack_258;
      auVar58._12_4_ = fVar204 * fStack_254;
      auVar58._16_4_ = fVar225 * fStack_250;
      auVar58._20_4_ = fVar205 * fStack_24c;
      auVar58._24_4_ = fVar226 * fStack_248;
      auVar58._28_4_ = auVar256._28_4_;
      auVar59._4_4_ = fVar227 * fStack_23c;
      auVar59._0_4_ = fVar206 * local_240;
      auVar59._8_4_ = fVar161 * fStack_238;
      auVar59._12_4_ = fVar176 * fStack_234;
      auVar59._16_4_ = fVar177 * fStack_230;
      auVar59._20_4_ = fVar178 * fStack_22c;
      auVar59._24_4_ = fVar179 * fStack_228;
      auVar59._28_4_ = uVar6;
      auVar115 = vsubps_avx(auVar58,auVar59);
      auVar60._4_4_ = fVar203 * auVar26._4_4_;
      auVar60._0_4_ = fVar223 * auVar26._0_4_;
      auVar60._8_4_ = fVar224 * auVar26._8_4_;
      auVar60._12_4_ = fVar204 * auVar26._12_4_;
      auVar60._16_4_ = fVar225 * auVar26._16_4_;
      auVar60._20_4_ = fVar205 * auVar26._20_4_;
      auVar60._24_4_ = fVar226 * auVar26._24_4_;
      auVar60._28_4_ = uVar6;
      auVar61._4_4_ = fVar227 * auVar25._4_4_;
      auVar61._0_4_ = fVar206 * auVar25._0_4_;
      auVar61._8_4_ = fVar161 * auVar25._8_4_;
      auVar61._12_4_ = fVar176 * auVar25._12_4_;
      auVar61._16_4_ = fVar177 * auVar25._16_4_;
      auVar61._20_4_ = fVar178 * auVar25._20_4_;
      auVar61._24_4_ = fVar179 * auVar25._24_4_;
      auVar61._28_4_ = local_200._28_4_;
      auVar25 = vsubps_avx(auVar60,auVar61);
      auVar62._4_4_ = auVar27._4_4_ * fVar203;
      auVar62._0_4_ = auVar27._0_4_ * fVar223;
      auVar62._8_4_ = auVar27._8_4_ * fVar224;
      auVar62._12_4_ = auVar27._12_4_ * fVar204;
      auVar62._16_4_ = auVar27._16_4_ * fVar225;
      auVar62._20_4_ = auVar27._20_4_ * fVar205;
      auVar62._24_4_ = auVar27._24_4_ * fVar226;
      auVar62._28_4_ = auVar18._28_4_ + auVar19._28_4_;
      auVar63._4_4_ = auVar24._4_4_ * fVar227;
      auVar63._0_4_ = auVar24._0_4_ * fVar206;
      auVar63._8_4_ = auVar24._8_4_ * fVar161;
      auVar63._12_4_ = auVar24._12_4_ * fVar176;
      auVar63._16_4_ = auVar24._16_4_ * fVar177;
      auVar63._20_4_ = auVar24._20_4_ * fVar178;
      auVar63._24_4_ = auVar24._24_4_ * fVar179;
      auVar63._28_4_ = auVar20._28_4_ + fVar202;
      auVar24 = vsubps_avx(auVar62,auVar63);
      auVar19 = vminps_avx(auVar21,auVar87);
      auVar18 = vmaxps_avx(auVar21,auVar87);
      auVar20 = vminps_avx(auVar22,auVar23);
      auVar20 = vminps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(auVar22,auVar23);
      auVar18 = vmaxps_avx(auVar18,auVar19);
      auVar21 = vminps_avx(auVar88,auVar115);
      auVar19 = vmaxps_avx(auVar88,auVar115);
      auVar22 = vminps_avx(auVar25,auVar24);
      auVar21 = vminps_avx(auVar21,auVar22);
      auVar21 = vminps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar25,auVar24);
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vcmpps_avx(auVar21,local_280,2);
      auVar19 = vcmpps_avx(auVar19,local_2a0,5);
      auVar18 = vandps_avx(auVar19,auVar18);
      auVar86 = vandps_avx(auVar86,local_340);
      auVar19 = auVar86 & auVar18;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') {
        auVar86 = vandps_avx(auVar18,auVar86);
        uVar72 = vmovmskps_avx(auVar86);
      }
    }
    if (uVar72 != 0) {
      auStack_460[uVar78] = uVar72;
      uVar7 = vmovlps_avx(local_400);
      *(undefined8 *)(afStack_320 + uVar78 * 2) = uVar7;
      uVar8 = vmovlps_avx(local_700);
      auStack_1a0[uVar78] = uVar8;
      uVar78 = (ulong)((int)uVar78 + 1);
    }
    auVar331 = ZEXT864(0) << 0x20;
    do {
      if ((int)uVar78 == 0) {
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar95._4_4_ = uVar6;
        auVar95._0_4_ = uVar6;
        auVar95._8_4_ = uVar6;
        auVar95._12_4_ = uVar6;
        auVar95._16_4_ = uVar6;
        auVar95._20_4_ = uVar6;
        auVar95._24_4_ = uVar6;
        auVar95._28_4_ = uVar6;
        auVar86 = vcmpps_avx(local_2c0,auVar95,2);
        uVar71 = vmovmskps_avx(auVar86);
        uVar71 = (uint)uVar80 & uVar71;
        if (uVar71 == 0) {
          return;
        }
        goto LAB_010e271c;
      }
      uVar75 = (int)uVar78 - 1;
      uVar76 = (ulong)uVar75;
      uVar72 = auStack_460[uVar76];
      fVar202 = afStack_320[uVar76 * 2];
      fVar223 = afStack_320[uVar76 * 2 + 1];
      local_700._8_8_ = 0;
      local_700._0_8_ = auStack_1a0[uVar76];
      uVar8 = 0;
      if (uVar72 != 0) {
        for (; (uVar72 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      uVar72 = uVar72 - 1 & uVar72;
      auStack_460[uVar76] = uVar72;
      if (uVar72 == 0) {
        uVar78 = (ulong)uVar75;
      }
      fVar224 = (float)(uVar8 + 1) * 0.14285715;
      fVar203 = (1.0 - (float)uVar8 * 0.14285715) * fVar202 + fVar223 * (float)uVar8 * 0.14285715;
      fVar202 = (1.0 - fVar224) * fVar202 + fVar223 * fVar224;
      fVar223 = fVar202 - fVar203;
      if (0.16666667 <= fVar223) break;
      auVar105 = vshufps_avx(local_700,local_700,0x50);
      auVar126._8_4_ = 0x3f800000;
      auVar126._0_8_ = &DAT_3f8000003f800000;
      auVar126._12_4_ = 0x3f800000;
      auVar289 = vsubps_avx(auVar126,auVar105);
      fVar224 = auVar105._0_4_;
      fVar204 = auVar105._4_4_;
      fVar225 = auVar105._8_4_;
      fVar205 = auVar105._12_4_;
      fVar226 = auVar289._0_4_;
      fVar206 = auVar289._4_4_;
      fVar227 = auVar289._8_4_;
      fVar161 = auVar289._12_4_;
      auVar142._0_4_ = auVar276._0_4_ * fVar224 + fVar226 * (float)local_660._0_4_;
      auVar142._4_4_ = auVar276._4_4_ * fVar204 + fVar206 * (float)local_660._4_4_;
      auVar142._8_4_ = auVar276._0_4_ * fVar225 + fVar227 * (float)local_660._0_4_;
      auVar142._12_4_ = auVar276._4_4_ * fVar205 + fVar161 * (float)local_660._4_4_;
      auVar164._0_4_ = auVar248._0_4_ * fVar224 + fVar226 * fVar207;
      auVar164._4_4_ = auVar248._4_4_ * fVar204 + fVar206 * fVar228;
      auVar164._8_4_ = auVar248._0_4_ * fVar225 + fVar227 * fVar207;
      auVar164._12_4_ = auVar248._4_4_ * fVar205 + fVar161 * fVar228;
      auVar190._0_4_ = auVar99._0_4_ * fVar224 + auVar317._0_4_ * fVar226;
      auVar190._4_4_ = auVar99._4_4_ * fVar204 + auVar317._4_4_ * fVar206;
      auVar190._8_4_ = auVar99._0_4_ * fVar225 + auVar317._0_4_ * fVar227;
      auVar190._12_4_ = auVar99._4_4_ * fVar205 + auVar317._4_4_ * fVar161;
      auVar101._0_4_ = auVar82._0_4_ * fVar224 + auVar301._0_4_ * fVar226;
      auVar101._4_4_ = auVar82._4_4_ * fVar204 + auVar301._4_4_ * fVar206;
      auVar101._8_4_ = auVar82._0_4_ * fVar225 + auVar301._0_4_ * fVar227;
      auVar101._12_4_ = auVar82._4_4_ * fVar205 + auVar301._4_4_ * fVar161;
      auVar135._16_16_ = auVar142;
      auVar135._0_16_ = auVar142;
      auVar158._16_16_ = auVar164;
      auVar158._0_16_ = auVar164;
      auVar175._16_16_ = auVar190;
      auVar175._0_16_ = auVar190;
      auVar86 = vshufps_avx(ZEXT2032(CONCAT416(fVar202,ZEXT416((uint)fVar203))),
                            ZEXT2032(CONCAT416(fVar202,ZEXT416((uint)fVar203))),0);
      auVar18 = vsubps_avx(auVar158,auVar135);
      fVar224 = auVar86._0_4_;
      fVar204 = auVar86._4_4_;
      fVar225 = auVar86._8_4_;
      fVar205 = auVar86._12_4_;
      fVar226 = auVar86._16_4_;
      fVar206 = auVar86._20_4_;
      fVar227 = auVar86._24_4_;
      auVar136._0_4_ = auVar142._0_4_ + auVar18._0_4_ * fVar224;
      auVar136._4_4_ = auVar142._4_4_ + auVar18._4_4_ * fVar204;
      auVar136._8_4_ = auVar142._8_4_ + auVar18._8_4_ * fVar225;
      auVar136._12_4_ = auVar142._12_4_ + auVar18._12_4_ * fVar205;
      auVar136._16_4_ = auVar142._0_4_ + auVar18._16_4_ * fVar226;
      auVar136._20_4_ = auVar142._4_4_ + auVar18._20_4_ * fVar206;
      auVar136._24_4_ = auVar142._8_4_ + auVar18._24_4_ * fVar227;
      auVar136._28_4_ = auVar142._12_4_ + auVar18._28_4_;
      auVar18 = vsubps_avx(auVar175,auVar158);
      auVar159._0_4_ = auVar164._0_4_ + auVar18._0_4_ * fVar224;
      auVar159._4_4_ = auVar164._4_4_ + auVar18._4_4_ * fVar204;
      auVar159._8_4_ = auVar164._8_4_ + auVar18._8_4_ * fVar225;
      auVar159._12_4_ = auVar164._12_4_ + auVar18._12_4_ * fVar205;
      auVar159._16_4_ = auVar164._0_4_ + auVar18._16_4_ * fVar226;
      auVar159._20_4_ = auVar164._4_4_ + auVar18._20_4_ * fVar206;
      auVar159._24_4_ = auVar164._8_4_ + auVar18._24_4_ * fVar227;
      auVar159._28_4_ = auVar164._12_4_ + auVar18._28_4_;
      auVar105 = vsubps_avx(auVar101,auVar190);
      auVar119._0_4_ = auVar190._0_4_ + auVar105._0_4_ * fVar224;
      auVar119._4_4_ = auVar190._4_4_ + auVar105._4_4_ * fVar204;
      auVar119._8_4_ = auVar190._8_4_ + auVar105._8_4_ * fVar225;
      auVar119._12_4_ = auVar190._12_4_ + auVar105._12_4_ * fVar205;
      auVar119._16_4_ = auVar190._0_4_ + auVar105._0_4_ * fVar226;
      auVar119._20_4_ = auVar190._4_4_ + auVar105._4_4_ * fVar206;
      auVar119._24_4_ = auVar190._8_4_ + auVar105._8_4_ * fVar227;
      auVar119._28_4_ = auVar190._12_4_ + auVar105._12_4_;
      auVar18 = vsubps_avx(auVar159,auVar136);
      auVar137._0_4_ = auVar136._0_4_ + fVar224 * auVar18._0_4_;
      auVar137._4_4_ = auVar136._4_4_ + fVar204 * auVar18._4_4_;
      auVar137._8_4_ = auVar136._8_4_ + fVar225 * auVar18._8_4_;
      auVar137._12_4_ = auVar136._12_4_ + fVar205 * auVar18._12_4_;
      auVar137._16_4_ = auVar136._16_4_ + fVar226 * auVar18._16_4_;
      auVar137._20_4_ = auVar136._20_4_ + fVar206 * auVar18._20_4_;
      auVar137._24_4_ = auVar136._24_4_ + fVar227 * auVar18._24_4_;
      auVar137._28_4_ = auVar136._28_4_ + auVar18._28_4_;
      auVar18 = vsubps_avx(auVar119,auVar159);
      auVar120._0_4_ = auVar159._0_4_ + fVar224 * auVar18._0_4_;
      auVar120._4_4_ = auVar159._4_4_ + fVar204 * auVar18._4_4_;
      auVar120._8_4_ = auVar159._8_4_ + fVar225 * auVar18._8_4_;
      auVar120._12_4_ = auVar159._12_4_ + fVar205 * auVar18._12_4_;
      auVar120._16_4_ = auVar159._16_4_ + fVar226 * auVar18._16_4_;
      auVar120._20_4_ = auVar159._20_4_ + fVar206 * auVar18._20_4_;
      auVar120._24_4_ = auVar159._24_4_ + fVar227 * auVar18._24_4_;
      auVar120._28_4_ = auVar159._28_4_ + auVar18._28_4_;
      auVar18 = vsubps_avx(auVar120,auVar137);
      auVar143._0_4_ = auVar137._0_4_ + fVar224 * auVar18._0_4_;
      auVar143._4_4_ = auVar137._4_4_ + fVar204 * auVar18._4_4_;
      auVar143._8_4_ = auVar137._8_4_ + fVar225 * auVar18._8_4_;
      auVar143._12_4_ = auVar137._12_4_ + fVar205 * auVar18._12_4_;
      auVar160._16_4_ = auVar137._16_4_ + fVar226 * auVar18._16_4_;
      auVar160._0_16_ = auVar143;
      auVar160._20_4_ = auVar137._20_4_ + fVar206 * auVar18._20_4_;
      auVar160._24_4_ = auVar137._24_4_ + fVar227 * auVar18._24_4_;
      auVar160._28_4_ = auVar137._28_4_ + auVar159._28_4_;
      fVar224 = auVar18._4_4_ * 3.0;
      auVar127 = auVar160._16_16_;
      auVar104 = vshufps_avx(ZEXT416((uint)(fVar223 * 0.33333334)),
                             ZEXT416((uint)(fVar223 * 0.33333334)),0);
      auVar263._0_4_ = auVar143._0_4_ + auVar104._0_4_ * auVar18._0_4_ * 3.0;
      auVar263._4_4_ = auVar143._4_4_ + auVar104._4_4_ * fVar224;
      auVar263._8_4_ = auVar143._8_4_ + auVar104._8_4_ * auVar18._8_4_ * 3.0;
      auVar263._12_4_ = auVar143._12_4_ + auVar104._12_4_ * auVar18._12_4_ * 3.0;
      auVar198 = vshufpd_avx(auVar143,auVar143,3);
      auVar150 = vshufpd_avx(auVar127,auVar127,3);
      auVar105 = vsubps_avx(auVar198,auVar143);
      auVar289 = vsubps_avx(auVar150,auVar127);
      auVar102._0_4_ = auVar105._0_4_ + auVar289._0_4_;
      auVar102._4_4_ = auVar105._4_4_ + auVar289._4_4_;
      auVar102._8_4_ = auVar105._8_4_ + auVar289._8_4_;
      auVar102._12_4_ = auVar105._12_4_ + auVar289._12_4_;
      auVar105 = vmovshdup_avx(auVar143);
      auVar289 = vmovshdup_avx(auVar263);
      auVar149 = vshufps_avx(auVar102,auVar102,0);
      auVar84 = vshufps_avx(auVar102,auVar102,0x55);
      fVar206 = auVar84._0_4_;
      fVar227 = auVar84._4_4_;
      fVar161 = auVar84._8_4_;
      fVar176 = auVar84._12_4_;
      fVar204 = auVar149._0_4_;
      fVar225 = auVar149._4_4_;
      fVar205 = auVar149._8_4_;
      fVar226 = auVar149._12_4_;
      auVar249._0_4_ = fVar204 * auVar143._0_4_ + fVar206 * auVar105._0_4_;
      auVar249._4_4_ = fVar225 * auVar143._4_4_ + fVar227 * auVar105._4_4_;
      auVar249._8_4_ = fVar205 * auVar143._8_4_ + fVar161 * auVar105._8_4_;
      auVar249._12_4_ = fVar226 * auVar143._12_4_ + fVar176 * auVar105._12_4_;
      auVar264._0_4_ = auVar263._0_4_ * fVar204 + fVar206 * auVar289._0_4_;
      auVar264._4_4_ = auVar263._4_4_ * fVar225 + fVar227 * auVar289._4_4_;
      auVar264._8_4_ = auVar263._8_4_ * fVar205 + fVar161 * auVar289._8_4_;
      auVar264._12_4_ = auVar263._12_4_ * fVar226 + fVar176 * auVar289._12_4_;
      auVar289 = vshufps_avx(auVar249,auVar249,0xe8);
      auVar149 = vshufps_avx(auVar264,auVar264,0xe8);
      auVar105 = vcmpps_avx(auVar289,auVar149,1);
      uVar72 = vextractps_avx(auVar105,0);
      auVar84 = auVar264;
      if ((uVar72 & 1) == 0) {
        auVar84 = auVar249;
      }
      auVar103._0_4_ = auVar104._0_4_ * auVar18._16_4_ * 3.0;
      auVar103._4_4_ = auVar104._4_4_ * fVar224;
      auVar103._8_4_ = auVar104._8_4_ * auVar18._24_4_ * 3.0;
      auVar103._12_4_ = auVar104._12_4_ * auVar86._28_4_;
      auVar81 = vsubps_avx(auVar127,auVar103);
      auVar104 = vmovshdup_avx(auVar81);
      auVar127 = vmovshdup_avx(auVar127);
      fVar224 = auVar81._0_4_;
      fVar177 = auVar81._4_4_;
      auVar339._0_4_ = fVar204 * fVar224 + fVar206 * auVar104._0_4_;
      auVar339._4_4_ = fVar225 * fVar177 + fVar227 * auVar104._4_4_;
      auVar339._8_4_ = fVar205 * auVar81._8_4_ + fVar161 * auVar104._8_4_;
      auVar339._12_4_ = fVar226 * auVar81._12_4_ + fVar176 * auVar104._12_4_;
      auVar318._0_4_ = fVar204 * auVar160._16_4_ + fVar206 * auVar127._0_4_;
      auVar318._4_4_ = fVar225 * auVar160._20_4_ + fVar227 * auVar127._4_4_;
      auVar318._8_4_ = fVar205 * auVar160._24_4_ + fVar161 * auVar127._8_4_;
      auVar318._12_4_ = fVar226 * auVar160._28_4_ + fVar176 * auVar127._12_4_;
      auVar127 = vshufps_avx(auVar339,auVar339,0xe8);
      auVar261 = vshufps_avx(auVar318,auVar318,0xe8);
      auVar104 = vcmpps_avx(auVar127,auVar261,1);
      uVar72 = vextractps_avx(auVar104,0);
      auVar96 = auVar318;
      if ((uVar72 & 1) == 0) {
        auVar96 = auVar339;
      }
      auVar84 = vmaxss_avx(auVar96,auVar84);
      auVar289 = vminps_avx(auVar289,auVar149);
      auVar149 = vminps_avx(auVar127,auVar261);
      auVar149 = vminps_avx(auVar289,auVar149);
      auVar105 = vshufps_avx(auVar105,auVar105,0x55);
      auVar105 = vblendps_avx(auVar105,auVar104,2);
      auVar104 = vpslld_avx(auVar105,0x1f);
      auVar105 = vshufpd_avx(auVar264,auVar264,1);
      auVar105 = vinsertps_avx(auVar105,auVar318,0x9c);
      auVar289 = vshufpd_avx(auVar249,auVar249,1);
      auVar289 = vinsertps_avx(auVar289,auVar339,0x9c);
      auVar105 = vblendvps_avx(auVar289,auVar105,auVar104);
      auVar289 = vmovshdup_avx(auVar105);
      auVar105 = vmaxss_avx(auVar289,auVar105);
      fVar205 = auVar149._0_4_;
      auVar289 = vmovshdup_avx(auVar149);
      fVar225 = auVar105._0_4_;
      fVar226 = auVar289._0_4_;
      fVar204 = auVar84._0_4_;
      if ((0.0001 <= fVar205) || (fVar225 <= -0.0001)) {
        if ((-0.0001 < fVar204 && fVar226 < 0.0001) ||
           ((fVar205 < 0.0001 && -0.0001 < fVar204 || (fVar226 < 0.0001 && -0.0001 < fVar225))))
        goto LAB_010e3978;
LAB_010e441a:
        bVar64 = true;
        auVar331 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_010e3978:
        auVar331 = ZEXT864(0) << 0x20;
        auVar104 = vcmpps_avx(auVar149,ZEXT816(0) << 0x20,1);
        auVar289 = vcmpss_avx(auVar84,ZEXT416(0),1);
        auVar191._8_4_ = 0x3f800000;
        auVar191._0_8_ = &DAT_3f8000003f800000;
        auVar191._12_4_ = 0x3f800000;
        auVar265._8_4_ = 0xbf800000;
        auVar265._0_8_ = 0xbf800000bf800000;
        auVar265._12_4_ = 0xbf800000;
        auVar289 = vblendvps_avx(auVar191,auVar265,auVar289);
        auVar104 = vblendvps_avx(auVar191,auVar265,auVar104);
        auVar127 = vcmpss_avx(auVar289,auVar104,4);
        auVar127 = vpshufd_avx(ZEXT416(auVar127._0_4_ & 1),0x50);
        auVar127 = vpslld_avx(auVar127,0x1f);
        auVar127 = vpsrad_avx(auVar127,0x1f);
        auVar127 = vpandn_avx(auVar127,_DAT_02020eb0);
        auVar261 = vmovshdup_avx(auVar104);
        fVar206 = auVar261._0_4_;
        local_600 = auVar9._0_4_;
        fStack_5fc = auVar9._4_4_;
        fStack_5f8 = auVar9._8_4_;
        fStack_5f4 = auVar9._12_4_;
        if ((auVar104._0_4_ != fVar206) || (NAN(auVar104._0_4_) || NAN(fVar206))) {
          if ((fVar226 != fVar205) || (NAN(fVar226) || NAN(fVar205))) {
            fVar205 = -fVar205 / (fVar226 - fVar205);
            auVar104 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar205) * 0.0 + fVar205)));
          }
          else {
            auVar104 = vcmpss_avx(auVar149,ZEXT416(0),0);
            auVar104 = vpshufd_avx(ZEXT416(auVar104._0_4_ & 1),0x50);
            auVar104 = vpslld_avx(auVar104,0x1f);
            auVar104 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar104);
          }
          auVar261 = vcmpps_avx(auVar127,auVar104,1);
          auVar149 = vblendps_avx(auVar127,auVar104,2);
          auVar104 = vblendps_avx(auVar104,auVar127,2);
          auVar127 = vblendvps_avx(auVar104,auVar149,auVar261);
        }
        auVar105 = vcmpss_avx(auVar105,ZEXT416(0),1);
        auVar128._8_4_ = 0x3f800000;
        auVar128._0_8_ = &DAT_3f8000003f800000;
        auVar128._12_4_ = 0x3f800000;
        auVar192._8_4_ = 0xbf800000;
        auVar192._0_8_ = 0xbf800000bf800000;
        auVar192._12_4_ = 0xbf800000;
        auVar105 = vblendvps_avx(auVar128,auVar192,auVar105);
        fVar205 = auVar105._0_4_;
        if ((auVar289._0_4_ != fVar205) || (NAN(auVar289._0_4_) || NAN(fVar205))) {
          if ((fVar225 != fVar204) || (NAN(fVar225) || NAN(fVar204))) {
            fVar204 = -fVar204 / (fVar225 - fVar204);
            auVar105 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar204) * 0.0 + fVar204)));
          }
          else {
            auVar105 = vcmpss_avx(auVar84,ZEXT416(0),0);
            auVar105 = vpshufd_avx(ZEXT416(auVar105._0_4_ & 1),0x50);
            auVar105 = vpslld_avx(auVar105,0x1f);
            auVar105 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar105);
          }
          auVar104 = vcmpps_avx(auVar127,auVar105,1);
          auVar289 = vblendps_avx(auVar127,auVar105,2);
          auVar105 = vblendps_avx(auVar105,auVar127,2);
          auVar127 = vblendvps_avx(auVar105,auVar289,auVar104);
        }
        if ((fVar206 != fVar205) || (NAN(fVar206) || NAN(fVar205))) {
          auVar106._8_4_ = 0x3f800000;
          auVar106._0_8_ = &DAT_3f8000003f800000;
          auVar106._12_4_ = 0x3f800000;
          auVar105 = vcmpps_avx(auVar127,auVar106,1);
          auVar289 = vinsertps_avx(auVar127,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar193._4_12_ = auVar127._4_12_;
          auVar193._0_4_ = 0x3f800000;
          auVar127 = vblendvps_avx(auVar193,auVar289,auVar105);
        }
        auVar105 = vcmpps_avx(auVar127,_DAT_01fec6f0,1);
        auVar65._12_4_ = 0;
        auVar65._0_12_ = auVar127._4_12_;
        auVar289 = vinsertps_avx(auVar127,ZEXT416(0x3f800000),0x10);
        auVar105 = vblendvps_avx(auVar289,auVar65 << 0x20,auVar105);
        auVar289 = vmovshdup_avx(auVar105);
        bVar64 = true;
        if (auVar105._0_4_ <= auVar289._0_4_) {
          auVar107._0_4_ = auVar105._0_4_ + -0.1;
          auVar107._4_4_ = auVar105._4_4_ + 0.1;
          auVar107._8_4_ = auVar105._8_4_ + 0.0;
          auVar107._12_4_ = auVar105._12_4_ + 0.0;
          auVar104 = vshufpd_avx(auVar263,auVar263,3);
          auVar144._8_8_ = 0x3f80000000000000;
          auVar144._0_8_ = 0x3f80000000000000;
          auVar105 = vcmpps_avx(auVar107,auVar144,1);
          auVar66._12_4_ = 0;
          auVar66._0_12_ = auVar107._4_12_;
          auVar289 = vinsertps_avx(auVar107,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar105 = vblendvps_avx(auVar289,auVar66 << 0x20,auVar105);
          auVar289 = vshufpd_avx(auVar81,auVar81,3);
          auVar149 = vshufps_avx(auVar105,auVar105,0x50);
          auVar145._8_4_ = 0x3f800000;
          auVar145._0_8_ = &DAT_3f8000003f800000;
          auVar145._12_4_ = 0x3f800000;
          auVar84 = vsubps_avx(auVar145,auVar149);
          local_620 = auVar198._0_4_;
          fStack_61c = auVar198._4_4_;
          fStack_618 = auVar198._8_4_;
          fStack_614 = auVar198._12_4_;
          fVar204 = auVar149._0_4_;
          fVar225 = auVar149._4_4_;
          fVar205 = auVar149._8_4_;
          fVar226 = auVar149._12_4_;
          local_6c0 = auVar150._0_4_;
          fStack_6bc = auVar150._4_4_;
          fStack_6b8 = auVar150._8_4_;
          fStack_6b4 = auVar150._12_4_;
          fVar206 = auVar84._0_4_;
          fVar227 = auVar84._4_4_;
          fVar161 = auVar84._8_4_;
          fVar176 = auVar84._12_4_;
          auVar129._0_4_ = fVar204 * local_620 + fVar206 * auVar143._0_4_;
          auVar129._4_4_ = fVar225 * fStack_61c + fVar227 * auVar143._4_4_;
          auVar129._8_4_ = fVar205 * fStack_618 + fVar161 * auVar143._0_4_;
          auVar129._12_4_ = fVar226 * fStack_614 + fVar176 * auVar143._4_4_;
          auVar165._0_4_ = fVar204 * auVar104._0_4_ + fVar206 * auVar263._0_4_;
          auVar165._4_4_ = fVar225 * auVar104._4_4_ + fVar227 * auVar263._4_4_;
          auVar165._8_4_ = fVar205 * auVar104._8_4_ + fVar161 * auVar263._0_4_;
          auVar165._12_4_ = fVar226 * auVar104._12_4_ + fVar176 * auVar263._4_4_;
          auVar235._0_4_ = fVar204 * auVar289._0_4_ + fVar206 * fVar224;
          auVar235._4_4_ = fVar225 * auVar289._4_4_ + fVar227 * fVar177;
          auVar235._8_4_ = fVar205 * auVar289._8_4_ + fVar161 * fVar224;
          auVar235._12_4_ = fVar226 * auVar289._12_4_ + fVar176 * fVar177;
          auVar250._0_4_ = fVar204 * local_6c0 + fVar206 * auVar160._16_4_;
          auVar250._4_4_ = fVar225 * fStack_6bc + fVar227 * auVar160._20_4_;
          auVar250._8_4_ = fVar205 * fStack_6b8 + fVar161 * auVar160._16_4_;
          auVar250._12_4_ = fVar226 * fStack_6b4 + fVar176 * auVar160._20_4_;
          auVar150 = vsubps_avx(auVar145,auVar105);
          auVar289 = vmovshdup_avx(local_700);
          auVar198 = vmovsldup_avx(local_700);
          local_700._0_4_ = auVar150._0_4_ * auVar198._0_4_ + auVar289._0_4_ * auVar105._0_4_;
          local_700._4_4_ = auVar150._4_4_ * auVar198._4_4_ + auVar289._4_4_ * auVar105._4_4_;
          local_700._8_4_ = auVar150._8_4_ * auVar198._8_4_ + auVar289._8_4_ * auVar105._8_4_;
          local_700._12_4_ = auVar150._12_4_ * auVar198._12_4_ + auVar289._12_4_ * auVar105._12_4_;
          auVar81 = vmovshdup_avx(local_700);
          auVar105 = vsubps_avx(auVar165,auVar129);
          auVar194._0_4_ = auVar105._0_4_ * 3.0;
          auVar194._4_4_ = auVar105._4_4_ * 3.0;
          auVar194._8_4_ = auVar105._8_4_ * 3.0;
          auVar194._12_4_ = auVar105._12_4_ * 3.0;
          auVar105 = vsubps_avx(auVar235,auVar165);
          auVar215._0_4_ = auVar105._0_4_ * 3.0;
          auVar215._4_4_ = auVar105._4_4_ * 3.0;
          auVar215._8_4_ = auVar105._8_4_ * 3.0;
          auVar215._12_4_ = auVar105._12_4_ * 3.0;
          auVar105 = vsubps_avx(auVar250,auVar235);
          auVar266._0_4_ = auVar105._0_4_ * 3.0;
          auVar266._4_4_ = auVar105._4_4_ * 3.0;
          auVar266._8_4_ = auVar105._8_4_ * 3.0;
          auVar266._12_4_ = auVar105._12_4_ * 3.0;
          auVar289 = vminps_avx(auVar215,auVar266);
          auVar105 = vmaxps_avx(auVar215,auVar266);
          auVar289 = vminps_avx(auVar194,auVar289);
          auVar105 = vmaxps_avx(auVar194,auVar105);
          auVar198 = vshufpd_avx(auVar289,auVar289,3);
          auVar150 = vshufpd_avx(auVar105,auVar105,3);
          auVar289 = vminps_avx(auVar289,auVar198);
          auVar105 = vmaxps_avx(auVar105,auVar150);
          auVar198 = vshufps_avx(ZEXT416((uint)(1.0 / fVar223)),ZEXT416((uint)(1.0 / fVar223)),0);
          auVar195._0_4_ = auVar198._0_4_ * auVar289._0_4_;
          auVar195._4_4_ = auVar198._4_4_ * auVar289._4_4_;
          auVar195._8_4_ = auVar198._8_4_ * auVar289._8_4_;
          auVar195._12_4_ = auVar198._12_4_ * auVar289._12_4_;
          auVar216._0_4_ = auVar105._0_4_ * auVar198._0_4_;
          auVar216._4_4_ = auVar105._4_4_ * auVar198._4_4_;
          auVar216._8_4_ = auVar105._8_4_ * auVar198._8_4_;
          auVar216._12_4_ = auVar105._12_4_ * auVar198._12_4_;
          auVar84 = ZEXT416((uint)(1.0 / (auVar81._0_4_ - local_700._0_4_)));
          auVar105 = vshufpd_avx(auVar129,auVar129,3);
          auVar289 = vshufpd_avx(auVar165,auVar165,3);
          auVar198 = vshufpd_avx(auVar235,auVar235,3);
          auVar150 = vshufpd_avx(auVar250,auVar250,3);
          auVar105 = vsubps_avx(auVar105,auVar129);
          auVar104 = vsubps_avx(auVar289,auVar165);
          auVar149 = vsubps_avx(auVar198,auVar235);
          auVar150 = vsubps_avx(auVar150,auVar250);
          auVar289 = vminps_avx(auVar105,auVar104);
          auVar105 = vmaxps_avx(auVar105,auVar104);
          auVar198 = vminps_avx(auVar149,auVar150);
          auVar198 = vminps_avx(auVar289,auVar198);
          auVar289 = vmaxps_avx(auVar149,auVar150);
          auVar105 = vmaxps_avx(auVar105,auVar289);
          auVar289 = vshufps_avx(auVar84,auVar84,0);
          auVar277._0_4_ = auVar289._0_4_ * auVar198._0_4_;
          auVar277._4_4_ = auVar289._4_4_ * auVar198._4_4_;
          auVar277._8_4_ = auVar289._8_4_ * auVar198._8_4_;
          auVar277._12_4_ = auVar289._12_4_ * auVar198._12_4_;
          auVar290._0_4_ = auVar289._0_4_ * auVar105._0_4_;
          auVar290._4_4_ = auVar289._4_4_ * auVar105._4_4_;
          auVar290._8_4_ = auVar289._8_4_ * auVar105._8_4_;
          auVar290._12_4_ = auVar289._12_4_ * auVar105._12_4_;
          auVar105 = vmovsldup_avx(local_700);
          auVar236._4_12_ = auVar105._4_12_;
          auVar236._0_4_ = fVar203;
          auVar251._4_12_ = local_700._4_12_;
          auVar251._0_4_ = fVar202;
          auVar85._0_4_ = (fVar202 + fVar203) * 0.5;
          auVar85._4_4_ = (local_700._4_4_ + auVar105._4_4_) * 0.5;
          auVar85._8_4_ = (local_700._8_4_ + auVar105._8_4_) * 0.5;
          auVar85._12_4_ = (local_700._12_4_ + auVar105._12_4_) * 0.5;
          auVar105 = vshufps_avx(auVar85,auVar85,0);
          fVar224 = auVar105._0_4_;
          fVar204 = auVar105._4_4_;
          fVar225 = auVar105._8_4_;
          fVar205 = auVar105._12_4_;
          auVar166._0_4_ = local_600 + fVar224 * (float)local_350._0_4_;
          auVar166._4_4_ = fStack_5fc + fVar204 * (float)local_350._4_4_;
          auVar166._8_4_ = fStack_5f8 + fVar225 * fStack_348;
          auVar166._12_4_ = fStack_5f4 + fVar205 * fStack_344;
          local_560 = auVar10._0_4_;
          fStack_55c = auVar10._4_4_;
          fStack_558 = auVar10._8_4_;
          fStack_554 = auVar10._12_4_;
          auVar267._0_4_ = fVar224 * (float)local_360._0_4_ + local_560;
          auVar267._4_4_ = fVar204 * (float)local_360._4_4_ + fStack_55c;
          auVar267._8_4_ = fVar225 * fStack_358 + fStack_558;
          auVar267._12_4_ = fVar205 * fStack_354 + fStack_554;
          local_570 = auVar11._0_4_;
          fStack_56c = auVar11._4_4_;
          fStack_568 = auVar11._8_4_;
          fStack_564 = auVar11._12_4_;
          auVar302._0_4_ = fVar224 * (float)local_370._0_4_ + local_570;
          auVar302._4_4_ = fVar204 * (float)local_370._4_4_ + fStack_56c;
          auVar302._8_4_ = fVar225 * fStack_368 + fStack_568;
          auVar302._12_4_ = fVar205 * fStack_364 + fStack_564;
          auVar105 = vsubps_avx(auVar267,auVar166);
          auVar167._0_4_ = auVar105._0_4_ * fVar224 + auVar166._0_4_;
          auVar167._4_4_ = auVar105._4_4_ * fVar204 + auVar166._4_4_;
          auVar167._8_4_ = auVar105._8_4_ * fVar225 + auVar166._8_4_;
          auVar167._12_4_ = auVar105._12_4_ * fVar205 + auVar166._12_4_;
          auVar105 = vsubps_avx(auVar302,auVar267);
          auVar268._0_4_ = auVar267._0_4_ + auVar105._0_4_ * fVar224;
          auVar268._4_4_ = auVar267._4_4_ + auVar105._4_4_ * fVar204;
          auVar268._8_4_ = auVar267._8_4_ + auVar105._8_4_ * fVar225;
          auVar268._12_4_ = auVar267._12_4_ + auVar105._12_4_ * fVar205;
          auVar105 = vsubps_avx(auVar268,auVar167);
          fVar224 = auVar167._0_4_ + auVar105._0_4_ * fVar224;
          fVar204 = auVar167._4_4_ + auVar105._4_4_ * fVar204;
          auVar130._0_8_ = CONCAT44(fVar204,fVar224);
          auVar130._8_4_ = auVar167._8_4_ + auVar105._8_4_ * fVar225;
          auVar130._12_4_ = auVar167._12_4_ + auVar105._12_4_ * fVar205;
          fVar225 = auVar105._0_4_ * 3.0;
          fVar205 = auVar105._4_4_ * 3.0;
          auVar168._0_8_ = CONCAT44(fVar205,fVar225);
          auVar168._8_4_ = auVar105._8_4_ * 3.0;
          auVar168._12_4_ = auVar105._12_4_ * 3.0;
          auVar269._8_8_ = auVar130._0_8_;
          auVar269._0_8_ = auVar130._0_8_;
          auVar105 = vshufpd_avx(auVar130,auVar130,3);
          auVar289 = vshufps_avx(auVar85,auVar85,0x55);
          auVar149 = vsubps_avx(auVar105,auVar269);
          auVar270._0_4_ = auVar289._0_4_ * auVar149._0_4_ + fVar224;
          auVar270._4_4_ = auVar289._4_4_ * auVar149._4_4_ + fVar204;
          auVar270._8_4_ = auVar289._8_4_ * auVar149._8_4_ + fVar224;
          auVar270._12_4_ = auVar289._12_4_ * auVar149._12_4_ + fVar204;
          auVar319._8_8_ = auVar168._0_8_;
          auVar319._0_8_ = auVar168._0_8_;
          auVar105 = vshufpd_avx(auVar168,auVar168,1);
          auVar105 = vsubps_avx(auVar105,auVar319);
          auVar169._0_4_ = fVar225 + auVar289._0_4_ * auVar105._0_4_;
          auVar169._4_4_ = fVar205 + auVar289._4_4_ * auVar105._4_4_;
          auVar169._8_4_ = fVar225 + auVar289._8_4_ * auVar105._8_4_;
          auVar169._12_4_ = fVar205 + auVar289._12_4_ * auVar105._12_4_;
          auVar289 = vmovshdup_avx(auVar169);
          auVar320._0_8_ = auVar289._0_8_ ^ 0x8000000080000000;
          auVar320._8_4_ = auVar289._8_4_ ^ 0x80000000;
          auVar320._12_4_ = auVar289._12_4_ ^ 0x80000000;
          auVar198 = vmovshdup_avx(auVar149);
          auVar105 = vunpcklps_avx(auVar198,auVar320);
          auVar150 = vshufps_avx(auVar105,auVar320,4);
          auVar131._0_8_ = auVar149._0_8_ ^ 0x8000000080000000;
          auVar131._8_4_ = -auVar149._8_4_;
          auVar131._12_4_ = -auVar149._12_4_;
          auVar105 = vmovlhps_avx(auVar131,auVar169);
          auVar104 = vshufps_avx(auVar105,auVar169,8);
          auVar105 = ZEXT416((uint)(auVar198._0_4_ * auVar169._0_4_ -
                                   auVar289._0_4_ * auVar149._0_4_));
          auVar289 = vshufps_avx(auVar105,auVar105,0);
          auVar105 = vdivps_avx(auVar150,auVar289);
          auVar289 = vdivps_avx(auVar104,auVar289);
          auVar104 = vinsertps_avx(auVar195,auVar277,0x1c);
          auVar149 = vinsertps_avx(auVar216,auVar290,0x1c);
          auVar84 = vinsertps_avx(auVar277,auVar195,0x4c);
          auVar127 = vinsertps_avx(auVar290,auVar216,0x4c);
          auVar198 = vmovsldup_avx(auVar105);
          auVar291._0_4_ = auVar198._0_4_ * auVar104._0_4_;
          auVar291._4_4_ = auVar198._4_4_ * auVar104._4_4_;
          auVar291._8_4_ = auVar198._8_4_ * auVar104._8_4_;
          auVar291._12_4_ = auVar198._12_4_ * auVar104._12_4_;
          auVar278._0_4_ = auVar198._0_4_ * auVar149._0_4_;
          auVar278._4_4_ = auVar198._4_4_ * auVar149._4_4_;
          auVar278._8_4_ = auVar198._8_4_ * auVar149._8_4_;
          auVar278._12_4_ = auVar198._12_4_ * auVar149._12_4_;
          auVar150 = vminps_avx(auVar291,auVar278);
          auVar198 = vmaxps_avx(auVar278,auVar291);
          auVar261 = vmovsldup_avx(auVar289);
          auVar340._0_4_ = auVar261._0_4_ * auVar84._0_4_;
          auVar340._4_4_ = auVar261._4_4_ * auVar84._4_4_;
          auVar340._8_4_ = auVar261._8_4_ * auVar84._8_4_;
          auVar340._12_4_ = auVar261._12_4_ * auVar84._12_4_;
          auVar279._0_4_ = auVar261._0_4_ * auVar127._0_4_;
          auVar279._4_4_ = auVar261._4_4_ * auVar127._4_4_;
          auVar279._8_4_ = auVar261._8_4_ * auVar127._8_4_;
          auVar279._12_4_ = auVar261._12_4_ * auVar127._12_4_;
          auVar261 = vminps_avx(auVar340,auVar279);
          auVar108._0_4_ = auVar150._0_4_ + auVar261._0_4_;
          auVar108._4_4_ = auVar150._4_4_ + auVar261._4_4_;
          auVar108._8_4_ = auVar150._8_4_ + auVar261._8_4_;
          auVar108._12_4_ = auVar150._12_4_ + auVar261._12_4_;
          auVar150 = vmaxps_avx(auVar279,auVar340);
          auVar261 = vsubps_avx(auVar236,auVar85);
          auVar96 = vsubps_avx(auVar251,auVar85);
          auVar252._0_4_ = auVar198._0_4_ + auVar150._0_4_;
          auVar252._4_4_ = auVar198._4_4_ + auVar150._4_4_;
          auVar252._8_4_ = auVar198._8_4_ + auVar150._8_4_;
          auVar252._12_4_ = auVar198._12_4_ + auVar150._12_4_;
          auVar292._8_8_ = 0x3f800000;
          auVar292._0_8_ = 0x3f800000;
          auVar198 = vsubps_avx(auVar292,auVar252);
          auVar150 = vsubps_avx(auVar292,auVar108);
          fVar227 = auVar261._0_4_;
          auVar293._0_4_ = fVar227 * auVar198._0_4_;
          fVar161 = auVar261._4_4_;
          auVar293._4_4_ = fVar161 * auVar198._4_4_;
          fVar176 = auVar261._8_4_;
          auVar293._8_4_ = fVar176 * auVar198._8_4_;
          fVar177 = auVar261._12_4_;
          auVar293._12_4_ = fVar177 * auVar198._12_4_;
          fVar225 = auVar96._0_4_;
          auVar253._0_4_ = auVar198._0_4_ * fVar225;
          fVar205 = auVar96._4_4_;
          auVar253._4_4_ = auVar198._4_4_ * fVar205;
          fVar226 = auVar96._8_4_;
          auVar253._8_4_ = auVar198._8_4_ * fVar226;
          fVar206 = auVar96._12_4_;
          auVar253._12_4_ = auVar198._12_4_ * fVar206;
          auVar329._0_4_ = fVar227 * auVar150._0_4_;
          auVar329._4_4_ = fVar161 * auVar150._4_4_;
          auVar329._8_4_ = fVar176 * auVar150._8_4_;
          auVar329._12_4_ = fVar177 * auVar150._12_4_;
          auVar109._0_4_ = fVar225 * auVar150._0_4_;
          auVar109._4_4_ = fVar205 * auVar150._4_4_;
          auVar109._8_4_ = fVar226 * auVar150._8_4_;
          auVar109._12_4_ = fVar206 * auVar150._12_4_;
          auVar198 = vminps_avx(auVar293,auVar329);
          auVar150 = vminps_avx(auVar253,auVar109);
          auVar261 = vminps_avx(auVar198,auVar150);
          auVar198 = vmaxps_avx(auVar329,auVar293);
          auVar150 = vmaxps_avx(auVar109,auVar253);
          auVar96 = vshufps_avx(auVar85,auVar85,0x54);
          auVar150 = vmaxps_avx(auVar150,auVar198);
          auVar97 = vshufps_avx(auVar270,auVar270,0);
          auVar122 = vshufps_avx(auVar270,auVar270,0x55);
          auVar198 = vhaddps_avx(auVar261,auVar261);
          auVar150 = vhaddps_avx(auVar150,auVar150);
          auVar254._0_4_ = auVar97._0_4_ * auVar105._0_4_ + auVar122._0_4_ * auVar289._0_4_;
          auVar254._4_4_ = auVar97._4_4_ * auVar105._4_4_ + auVar122._4_4_ * auVar289._4_4_;
          auVar254._8_4_ = auVar97._8_4_ * auVar105._8_4_ + auVar122._8_4_ * auVar289._8_4_;
          auVar254._12_4_ = auVar97._12_4_ * auVar105._12_4_ + auVar122._12_4_ * auVar289._12_4_;
          auVar261 = vsubps_avx(auVar96,auVar254);
          fVar224 = auVar261._0_4_ + auVar198._0_4_;
          fVar204 = auVar261._0_4_ + auVar150._0_4_;
          auVar198 = vmaxss_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar224));
          auVar150 = vminss_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar202));
          if (auVar198._0_4_ <= auVar150._0_4_) {
            auVar198 = vmovshdup_avx(auVar105);
            auVar146._0_4_ = auVar104._0_4_ * auVar198._0_4_;
            auVar146._4_4_ = auVar104._4_4_ * auVar198._4_4_;
            auVar146._8_4_ = auVar104._8_4_ * auVar198._8_4_;
            auVar146._12_4_ = auVar104._12_4_ * auVar198._12_4_;
            auVar110._0_4_ = auVar149._0_4_ * auVar198._0_4_;
            auVar110._4_4_ = auVar149._4_4_ * auVar198._4_4_;
            auVar110._8_4_ = auVar149._8_4_ * auVar198._8_4_;
            auVar110._12_4_ = auVar149._12_4_ * auVar198._12_4_;
            auVar150 = vminps_avx(auVar146,auVar110);
            auVar198 = vmaxps_avx(auVar110,auVar146);
            auVar104 = vmovshdup_avx(auVar289);
            auVar196._0_4_ = auVar104._0_4_ * auVar84._0_4_;
            auVar196._4_4_ = auVar104._4_4_ * auVar84._4_4_;
            auVar196._8_4_ = auVar104._8_4_ * auVar84._8_4_;
            auVar196._12_4_ = auVar104._12_4_ * auVar84._12_4_;
            auVar147._0_4_ = auVar104._0_4_ * auVar127._0_4_;
            auVar147._4_4_ = auVar104._4_4_ * auVar127._4_4_;
            auVar147._8_4_ = auVar104._8_4_ * auVar127._8_4_;
            auVar147._12_4_ = auVar104._12_4_ * auVar127._12_4_;
            auVar104 = vminps_avx(auVar196,auVar147);
            auVar217._0_4_ = auVar150._0_4_ + auVar104._0_4_;
            auVar217._4_4_ = auVar150._4_4_ + auVar104._4_4_;
            auVar217._8_4_ = auVar150._8_4_ + auVar104._8_4_;
            auVar217._12_4_ = auVar150._12_4_ + auVar104._12_4_;
            auVar150 = vmaxps_avx(auVar147,auVar196);
            auVar111._0_4_ = auVar198._0_4_ + auVar150._0_4_;
            auVar111._4_4_ = auVar198._4_4_ + auVar150._4_4_;
            auVar111._8_4_ = auVar198._8_4_ + auVar150._8_4_;
            auVar111._12_4_ = auVar198._12_4_ + auVar150._12_4_;
            auVar198 = vsubps_avx(auVar144,auVar111);
            auVar150 = vsubps_avx(auVar144,auVar217);
            auVar197._0_4_ = fVar227 * auVar198._0_4_;
            auVar197._4_4_ = fVar161 * auVar198._4_4_;
            auVar197._8_4_ = fVar176 * auVar198._8_4_;
            auVar197._12_4_ = fVar177 * auVar198._12_4_;
            auVar218._0_4_ = fVar227 * auVar150._0_4_;
            auVar218._4_4_ = fVar161 * auVar150._4_4_;
            auVar218._8_4_ = fVar176 * auVar150._8_4_;
            auVar218._12_4_ = fVar177 * auVar150._12_4_;
            auVar112._0_4_ = fVar225 * auVar198._0_4_;
            auVar112._4_4_ = fVar205 * auVar198._4_4_;
            auVar112._8_4_ = fVar226 * auVar198._8_4_;
            auVar112._12_4_ = fVar206 * auVar198._12_4_;
            auVar148._0_4_ = fVar225 * auVar150._0_4_;
            auVar148._4_4_ = fVar205 * auVar150._4_4_;
            auVar148._8_4_ = fVar226 * auVar150._8_4_;
            auVar148._12_4_ = fVar206 * auVar150._12_4_;
            auVar198 = vminps_avx(auVar197,auVar218);
            auVar150 = vminps_avx(auVar112,auVar148);
            auVar198 = vminps_avx(auVar198,auVar150);
            auVar150 = vmaxps_avx(auVar218,auVar197);
            auVar104 = vmaxps_avx(auVar148,auVar112);
            auVar198 = vhaddps_avx(auVar198,auVar198);
            auVar150 = vmaxps_avx(auVar104,auVar150);
            auVar150 = vhaddps_avx(auVar150,auVar150);
            auVar104 = vmovshdup_avx(auVar261);
            auVar149 = ZEXT416((uint)(auVar104._0_4_ + auVar198._0_4_));
            auVar198 = vmaxss_avx(local_700,auVar149);
            auVar104 = ZEXT416((uint)(auVar104._0_4_ + auVar150._0_4_));
            auVar150 = vminss_avx(auVar104,auVar81);
            auVar280._8_4_ = 0x7fffffff;
            auVar280._0_8_ = 0x7fffffff7fffffff;
            auVar280._12_4_ = 0x7fffffff;
            if (auVar198._0_4_ <= auVar150._0_4_) {
              uVar72 = 0;
              auVar331 = ZEXT864(0) << 0x20;
              if ((fVar203 < fVar224) && (uVar72 = 0, fVar204 < fVar202)) {
                auVar198 = vcmpps_avx(auVar104,auVar81,1);
                auVar150 = vcmpps_avx(local_700,auVar149,1);
                auVar198 = vandps_avx(auVar150,auVar198);
                uVar72 = auVar198._0_4_;
              }
              if (((uint)uVar78 < 4 && 0.001 <= fVar223) && (uVar72 & 1) == 0) {
                bVar64 = false;
              }
              else {
                lVar74 = 200;
                do {
                  fVar224 = auVar261._0_4_;
                  fVar223 = 1.0 - fVar224;
                  auVar198 = ZEXT416((uint)(fVar223 * fVar223 * fVar223));
                  auVar198 = vshufps_avx(auVar198,auVar198,0);
                  auVar150 = ZEXT416((uint)(fVar224 * 3.0 * fVar223 * fVar223));
                  auVar150 = vshufps_avx(auVar150,auVar150,0);
                  auVar104 = ZEXT416((uint)(fVar223 * fVar224 * fVar224 * 3.0));
                  auVar104 = vshufps_avx(auVar104,auVar104,0);
                  auVar149 = ZEXT416((uint)(fVar224 * fVar224 * fVar224));
                  auVar149 = vshufps_avx(auVar149,auVar149,0);
                  fVar223 = local_600 * auVar198._0_4_ +
                            local_560 * auVar150._0_4_ +
                            (float)local_470._0_4_ * auVar149._0_4_ + local_570 * auVar104._0_4_;
                  fVar224 = fStack_5fc * auVar198._4_4_ +
                            fStack_55c * auVar150._4_4_ +
                            (float)local_470._4_4_ * auVar149._4_4_ + fStack_56c * auVar104._4_4_;
                  auVar113._0_8_ = CONCAT44(fVar224,fVar223);
                  auVar113._8_4_ =
                       fStack_5f8 * auVar198._8_4_ +
                       fStack_558 * auVar150._8_4_ +
                       fStack_468 * auVar149._8_4_ + fStack_568 * auVar104._8_4_;
                  auVar113._12_4_ =
                       fStack_5f4 * auVar198._12_4_ +
                       fStack_554 * auVar150._12_4_ +
                       fStack_464 * auVar149._12_4_ + fStack_564 * auVar104._12_4_;
                  auVar151._8_8_ = auVar113._0_8_;
                  auVar151._0_8_ = auVar113._0_8_;
                  auVar150 = vshufpd_avx(auVar113,auVar113,1);
                  auVar198 = vmovshdup_avx(auVar261);
                  auVar150 = vsubps_avx(auVar150,auVar151);
                  auVar114._0_4_ = auVar198._0_4_ * auVar150._0_4_ + fVar223;
                  auVar114._4_4_ = auVar198._4_4_ * auVar150._4_4_ + fVar224;
                  auVar114._8_4_ = auVar198._8_4_ * auVar150._8_4_ + fVar223;
                  auVar114._12_4_ = auVar198._12_4_ * auVar150._12_4_ + fVar224;
                  auVar198 = vshufps_avx(auVar114,auVar114,0);
                  auVar150 = vshufps_avx(auVar114,auVar114,0x55);
                  auVar152._0_4_ = auVar105._0_4_ * auVar198._0_4_ + auVar289._0_4_ * auVar150._0_4_
                  ;
                  auVar152._4_4_ = auVar105._4_4_ * auVar198._4_4_ + auVar289._4_4_ * auVar150._4_4_
                  ;
                  auVar152._8_4_ = auVar105._8_4_ * auVar198._8_4_ + auVar289._8_4_ * auVar150._8_4_
                  ;
                  auVar152._12_4_ =
                       auVar105._12_4_ * auVar198._12_4_ + auVar289._12_4_ * auVar150._12_4_;
                  auVar261 = vsubps_avx(auVar261,auVar152);
                  auVar198 = vandps_avx(auVar280,auVar114);
                  auVar150 = vshufps_avx(auVar198,auVar198,0xf5);
                  auVar198 = vmaxss_avx(auVar150,auVar198);
                  if (auVar198._0_4_ < fVar208) {
                    fVar223 = auVar261._0_4_;
                    if ((0.0 <= fVar223) && (fVar223 <= 1.0)) {
                      auVar105 = vmovshdup_avx(auVar261);
                      fVar224 = auVar105._0_4_;
                      if ((0.0 <= fVar224) && (fVar224 <= 1.0)) {
                        auVar105 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar127 = vinsertps_avx(auVar105,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar105 = vdpps_avx(auVar127,local_380,0x7f);
                        auVar289 = vdpps_avx(auVar127,local_390,0x7f);
                        auVar198 = vdpps_avx(auVar127,local_3a0,0x7f);
                        auVar150 = vdpps_avx(auVar127,local_3b0,0x7f);
                        auVar104 = vdpps_avx(auVar127,local_3c0,0x7f);
                        auVar149 = vdpps_avx(auVar127,local_3d0,0x7f);
                        auVar84 = vdpps_avx(auVar127,local_3e0,0x7f);
                        auVar127 = vdpps_avx(auVar127,local_3f0,0x7f);
                        fVar206 = 1.0 - fVar224;
                        fVar227 = 1.0 - fVar223;
                        fVar204 = auVar261._4_4_;
                        fVar225 = auVar261._8_4_;
                        fVar205 = auVar261._12_4_;
                        fVar226 = fVar227 * fVar223 * fVar223 * 3.0;
                        auVar237._0_4_ = fVar223 * fVar223 * fVar223;
                        auVar237._4_4_ = fVar204 * fVar204 * fVar204;
                        auVar237._8_4_ = fVar225 * fVar225 * fVar225;
                        auVar237._12_4_ = fVar205 * fVar205 * fVar205;
                        fVar225 = fVar227 * fVar227 * fVar223 * 3.0;
                        fVar205 = fVar227 * fVar227 * fVar227;
                        fVar204 = fVar205 * (fVar206 * auVar105._0_4_ + fVar224 * auVar104._0_4_) +
                                  (fVar206 * auVar289._0_4_ + auVar149._0_4_ * fVar224) * fVar225 +
                                  fVar226 * (auVar84._0_4_ * fVar224 + fVar206 * auVar198._0_4_) +
                                  auVar237._0_4_ *
                                  (fVar206 * auVar150._0_4_ + fVar224 * auVar127._0_4_);
                        if (((fVar182 <= fVar204) &&
                            (fVar206 = *(float *)(ray + k * 4 + 0x100), fVar204 <= fVar206)) &&
                           (pGVar13 = (context->scene->geometries).items[uVar71].ptr,
                           (pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
                          auStack_f0 = vshufps_avx(auVar261,auVar261,0x55);
                          auVar271._8_4_ = 0x3f800000;
                          auVar271._0_8_ = &DAT_3f8000003f800000;
                          auVar271._12_4_ = 0x3f800000;
                          auVar105 = vsubps_avx(auVar271,auStack_f0);
                          fVar161 = auStack_f0._0_4_;
                          fVar176 = auStack_f0._4_4_;
                          fVar177 = auStack_f0._8_4_;
                          fVar178 = auStack_f0._12_4_;
                          fVar179 = auVar105._0_4_;
                          fVar180 = auVar105._4_4_;
                          fVar181 = auVar105._8_4_;
                          fVar285 = auVar105._12_4_;
                          auVar281._0_4_ =
                               fVar161 * (float)local_490._0_4_ + fVar179 * (float)local_480._0_4_;
                          auVar281._4_4_ =
                               fVar176 * (float)local_490._4_4_ + fVar180 * (float)local_480._4_4_;
                          auVar281._8_4_ = fVar177 * fStack_488 + fVar181 * fStack_478;
                          auVar281._12_4_ = fVar178 * fStack_484 + fVar285 * fStack_474;
                          auVar294._0_4_ =
                               fVar161 * (float)local_4e0._0_4_ + fVar179 * (float)local_4c0._0_4_;
                          auVar294._4_4_ =
                               fVar176 * (float)local_4e0._4_4_ + fVar180 * (float)local_4c0._4_4_;
                          auVar294._8_4_ = fVar177 * fStack_4d8 + fVar181 * fStack_4b8;
                          auVar294._12_4_ = fVar178 * fStack_4d4 + fVar285 * fStack_4b4;
                          auVar303._0_4_ =
                               fVar161 * (float)local_410._0_4_ + fVar179 * (float)local_4d0._0_4_;
                          auVar303._4_4_ =
                               fVar176 * (float)local_410._4_4_ + fVar180 * (float)local_4d0._4_4_;
                          auVar303._8_4_ = fVar177 * fStack_408 + fVar181 * fStack_4c8;
                          auVar303._12_4_ = fVar178 * fStack_404 + fVar285 * fStack_4c4;
                          auVar272._0_4_ =
                               fVar161 * (float)local_4b0._0_4_ + fVar179 * (float)local_4a0._0_4_;
                          auVar272._4_4_ =
                               fVar176 * (float)local_4b0._4_4_ + fVar180 * (float)local_4a0._4_4_;
                          auVar272._8_4_ = fVar177 * fStack_4a8 + fVar181 * fStack_498;
                          auVar272._12_4_ = fVar178 * fStack_4a4 + fVar285 * fStack_494;
                          auVar150 = vsubps_avx(auVar294,auVar281);
                          auVar104 = vsubps_avx(auVar303,auVar294);
                          auVar149 = vsubps_avx(auVar272,auVar303);
                          auStack_110 = vshufps_avx(auVar261,auVar261,0);
                          fVar178 = auStack_110._0_4_;
                          fVar179 = auStack_110._4_4_;
                          fVar180 = auStack_110._8_4_;
                          fVar181 = auStack_110._12_4_;
                          auVar105 = vshufps_avx(ZEXT416((uint)fVar227),ZEXT416((uint)fVar227),0);
                          fVar227 = auVar105._0_4_;
                          fVar161 = auVar105._4_4_;
                          fVar176 = auVar105._8_4_;
                          fVar177 = auVar105._12_4_;
                          auVar105 = vshufps_avx(auVar237,auVar237,0);
                          auVar289 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
                          auVar198 = vshufps_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar225),0);
                          auVar219._0_4_ =
                               (fVar227 * (fVar227 * auVar150._0_4_ + fVar178 * auVar104._0_4_) +
                               fVar178 * (fVar227 * auVar104._0_4_ + fVar178 * auVar149._0_4_)) *
                               3.0;
                          auVar219._4_4_ =
                               (fVar161 * (fVar161 * auVar150._4_4_ + fVar179 * auVar104._4_4_) +
                               fVar179 * (fVar161 * auVar104._4_4_ + fVar179 * auVar149._4_4_)) *
                               3.0;
                          auVar219._8_4_ =
                               (fVar176 * (fVar176 * auVar150._8_4_ + fVar180 * auVar104._8_4_) +
                               fVar180 * (fVar176 * auVar104._8_4_ + fVar180 * auVar149._8_4_)) *
                               3.0;
                          auVar219._12_4_ =
                               (fVar177 * (fVar177 * auVar150._12_4_ + fVar181 * auVar104._12_4_) +
                               fVar181 * (fVar177 * auVar104._12_4_ + fVar181 * auVar149._12_4_)) *
                               3.0;
                          auVar150 = vshufps_avx(ZEXT416((uint)fVar205),ZEXT416((uint)fVar205),0);
                          auVar170._0_4_ =
                               auVar150._0_4_ * (float)local_420._0_4_ +
                               auVar198._0_4_ * (float)local_430._0_4_ +
                               auVar105._0_4_ * (float)local_450._0_4_ +
                               auVar289._0_4_ * (float)local_440._0_4_;
                          auVar170._4_4_ =
                               auVar150._4_4_ * (float)local_420._4_4_ +
                               auVar198._4_4_ * (float)local_430._4_4_ +
                               auVar105._4_4_ * (float)local_450._4_4_ +
                               auVar289._4_4_ * (float)local_440._4_4_;
                          auVar170._8_4_ =
                               auVar150._8_4_ * fStack_418 +
                               auVar198._8_4_ * fStack_428 +
                               auVar105._8_4_ * fStack_448 + auVar289._8_4_ * fStack_438;
                          auVar170._12_4_ =
                               auVar150._12_4_ * fStack_414 +
                               auVar198._12_4_ * fStack_424 +
                               auVar105._12_4_ * fStack_444 + auVar289._12_4_ * fStack_434;
                          auVar105 = vshufps_avx(auVar219,auVar219,0xc9);
                          auVar199._0_4_ = auVar170._0_4_ * auVar105._0_4_;
                          auVar199._4_4_ = auVar170._4_4_ * auVar105._4_4_;
                          auVar199._8_4_ = auVar170._8_4_ * auVar105._8_4_;
                          auVar199._12_4_ = auVar170._12_4_ * auVar105._12_4_;
                          auVar105 = vshufps_avx(auVar170,auVar170,0xc9);
                          auVar171._0_4_ = auVar219._0_4_ * auVar105._0_4_;
                          auVar171._4_4_ = auVar219._4_4_ * auVar105._4_4_;
                          auVar171._8_4_ = auVar219._8_4_ * auVar105._8_4_;
                          auVar171._12_4_ = auVar219._12_4_ * auVar105._12_4_;
                          auVar105 = vsubps_avx(auVar171,auVar199);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x100) = fVar204;
                            uVar6 = vextractps_avx(auVar105,1);
                            *(undefined4 *)(ray + k * 4 + 0x180) = uVar6;
                            uVar6 = vextractps_avx(auVar105,2);
                            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar6;
                            *(int *)(ray + k * 4 + 0x1c0) = auVar105._0_4_;
                            *(float *)(ray + k * 4 + 0x1e0) = fVar223;
                            *(float *)(ray + k * 4 + 0x200) = fVar224;
                            *(uint *)(ray + k * 4 + 0x220) = uVar77;
                            *(uint *)(ray + k * 4 + 0x240) = uVar71;
                            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                          }
                          else {
                            auStack_170 = vshufps_avx(auVar105,auVar105,0x55);
                            auStack_150 = vshufps_avx(auVar105,auVar105,0xaa);
                            auStack_130 = vshufps_avx(auVar105,auVar105,0);
                            local_180[0] = (RTCHitN)auStack_170[0];
                            local_180[1] = (RTCHitN)auStack_170[1];
                            local_180[2] = (RTCHitN)auStack_170[2];
                            local_180[3] = (RTCHitN)auStack_170[3];
                            local_180[4] = (RTCHitN)auStack_170[4];
                            local_180[5] = (RTCHitN)auStack_170[5];
                            local_180[6] = (RTCHitN)auStack_170[6];
                            local_180[7] = (RTCHitN)auStack_170[7];
                            local_180[8] = (RTCHitN)auStack_170[8];
                            local_180[9] = (RTCHitN)auStack_170[9];
                            local_180[10] = (RTCHitN)auStack_170[10];
                            local_180[0xb] = (RTCHitN)auStack_170[0xb];
                            local_180[0xc] = (RTCHitN)auStack_170[0xc];
                            local_180[0xd] = (RTCHitN)auStack_170[0xd];
                            local_180[0xe] = (RTCHitN)auStack_170[0xe];
                            local_180[0xf] = (RTCHitN)auStack_170[0xf];
                            local_160 = auStack_150;
                            local_140 = auStack_130;
                            local_120 = auStack_110;
                            local_100 = auStack_f0;
                            local_e0 = local_300._0_8_;
                            uStack_d8 = local_300._8_8_;
                            uStack_d0 = local_300._16_8_;
                            uStack_c8 = local_300._24_8_;
                            local_c0 = local_2e0._0_8_;
                            uStack_b8 = local_2e0._8_8_;
                            uStack_b0 = local_2e0._16_8_;
                            uStack_a8 = local_2e0._24_8_;
                            auVar86 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_9c = context->user->instID[0];
                            local_a0 = uStack_9c;
                            uStack_98 = uStack_9c;
                            uStack_94 = uStack_9c;
                            uStack_90 = uStack_9c;
                            uStack_8c = uStack_9c;
                            uStack_84 = auVar86._28_4_;
                            uVar72 = uStack_84;
                            uStack_88 = uStack_9c;
                            uStack_84 = uStack_9c;
                            uStack_7c = context->user->instPrimID[0];
                            local_80 = uStack_7c;
                            uStack_78 = uStack_7c;
                            uStack_74 = uStack_7c;
                            uStack_70 = uStack_7c;
                            uStack_6c = uStack_7c;
                            uStack_68 = uStack_7c;
                            uStack_64 = uStack_7c;
                            *(float *)(ray + k * 4 + 0x100) = fVar204;
                            local_540 = *(undefined8 *)(mm_lookupmask_ps + uVar73);
                            uStack_538 = *(undefined8 *)(mm_lookupmask_ps + uVar73 + 8);
                            local_530 = *(undefined8 *)(mm_lookupmask_ps + lVar79);
                            uStack_528 = *(undefined8 *)(mm_lookupmask_ps + lVar79 + 8);
                            local_510.valid = (int *)&local_540;
                            local_510.geometryUserPtr = pGVar13->userPtr;
                            local_510.context = context->user;
                            local_510.hit = local_180;
                            local_510.N = 8;
                            local_510.ray = (RTCRayN *)ray;
                            if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar13->intersectionFilterN)(&local_510);
                              auVar331 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            auVar67._8_8_ = uStack_538;
                            auVar67._0_8_ = local_540;
                            auVar105 = vpcmpeqd_avx(auVar331._0_16_,auVar67);
                            auVar69._8_8_ = uStack_528;
                            auVar69._0_8_ = local_530;
                            auVar289 = vpcmpeqd_avx(auVar331._0_16_,auVar69);
                            auVar93._16_16_ = auVar289;
                            auVar93._0_16_ = auVar105;
                            auVar18 = auVar86 & ~auVar93;
                            if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar18 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar18 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar18 >> 0x7f,0) == '\0') &&
                                  (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar18 >> 0xbf,0) == '\0') &&
                                (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar18[0x1f]) {
                              auVar94._0_4_ = auVar105._0_4_ ^ auVar86._0_4_;
                              auVar94._4_4_ = auVar105._4_4_ ^ auVar86._4_4_;
                              auVar94._8_4_ = auVar105._8_4_ ^ auVar86._8_4_;
                              auVar94._12_4_ = auVar105._12_4_ ^ auVar86._12_4_;
                              auVar94._16_4_ = auVar289._0_4_ ^ auVar86._16_4_;
                              auVar94._20_4_ = auVar289._4_4_ ^ auVar86._20_4_;
                              auVar94._24_4_ = auVar289._8_4_ ^ auVar86._24_4_;
                              auVar94._28_4_ = auVar289._12_4_ ^ uVar72;
                            }
                            else {
                              p_Var14 = context->args->filter;
                              if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var14)(&local_510);
                                auVar331 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar68._8_8_ = uStack_538;
                              auVar68._0_8_ = local_540;
                              auVar105 = vpcmpeqd_avx(auVar331._0_16_,auVar68);
                              auVar70._8_8_ = uStack_528;
                              auVar70._0_8_ = local_530;
                              auVar289 = vpcmpeqd_avx(auVar331._0_16_,auVar70);
                              auVar121._16_16_ = auVar289;
                              auVar121._0_16_ = auVar105;
                              auVar94._0_4_ = auVar105._0_4_ ^ auVar86._0_4_;
                              auVar94._4_4_ = auVar105._4_4_ ^ auVar86._4_4_;
                              auVar94._8_4_ = auVar105._8_4_ ^ auVar86._8_4_;
                              auVar94._12_4_ = auVar105._12_4_ ^ auVar86._12_4_;
                              auVar94._16_4_ = auVar289._0_4_ ^ auVar86._16_4_;
                              auVar94._20_4_ = auVar289._4_4_ ^ auVar86._20_4_;
                              auVar94._24_4_ = auVar289._8_4_ ^ auVar86._24_4_;
                              auVar94._28_4_ = auVar289._12_4_ ^ uVar72;
                              auVar86 = auVar86 & ~auVar121;
                              if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar86 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar86 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar86 >> 0x7f,0) != '\0')
                                    || (auVar86 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar86 >> 0xbf,0) != '\0')
                                  || (auVar86 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar86[0x1f] < '\0') {
                                auVar86 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])local_510.hit
                                                        );
                                *(undefined1 (*) [32])(local_510.ray + 0x180) = auVar86;
                                auVar86 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                                  (local_510.hit + 0x20));
                                *(undefined1 (*) [32])(local_510.ray + 0x1a0) = auVar86;
                                auVar86 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                                  (local_510.hit + 0x40));
                                *(undefined1 (*) [32])(local_510.ray + 0x1c0) = auVar86;
                                auVar86 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                                  (local_510.hit + 0x60));
                                *(undefined1 (*) [32])(local_510.ray + 0x1e0) = auVar86;
                                auVar86 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                                  (local_510.hit + 0x80));
                                *(undefined1 (*) [32])(local_510.ray + 0x200) = auVar86;
                                auVar86 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                                  (local_510.hit + 0xa0));
                                *(undefined1 (*) [32])(local_510.ray + 0x220) = auVar86;
                                auVar86 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                                  (local_510.hit + 0xc0));
                                *(undefined1 (*) [32])(local_510.ray + 0x240) = auVar86;
                                auVar86 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                                  (local_510.hit + 0xe0));
                                *(undefined1 (*) [32])(local_510.ray + 0x260) = auVar86;
                                auVar86 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])
                                                                  (local_510.hit + 0x100));
                                *(undefined1 (*) [32])(local_510.ray + 0x280) = auVar86;
                              }
                            }
                            if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar94 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar94 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar94 >> 0x7f,0) == '\0') &&
                                  (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar94 >> 0xbf,0) == '\0') &&
                                (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar94[0x1f]) {
                              *(float *)(ray + k * 4 + 0x100) = fVar206;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar74 = lVar74 + -1;
                } while (lVar74 != 0);
              }
              goto LAB_010e4407;
            }
          }
          goto LAB_010e441a;
        }
      }
LAB_010e4407:
    } while (bVar64);
    _local_6a0 = ZEXT416((uint)fVar203);
    local_400 = vinsertps_avx(_local_6a0,ZEXT416((uint)fVar202),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }